

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

void embree::avx2::CurveNiIntersector1<4>::
     intersect_t<embree::avx2::RibbonCurve1Intersector1<embree::CatmullRomCurveT,8>,embree::avx2::Intersect1EpilogMU<8,true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  undefined1 (*pauVar1) [16];
  undefined1 (*pauVar2) [16];
  undefined1 (*pauVar3) [16];
  undefined1 (*pauVar4) [16];
  undefined1 (*pauVar5) [32];
  float *pfVar6;
  uint uVar7;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar9;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar10;
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  Primitive PVar13;
  int iVar14;
  RTCFilterFunctionN p_Var15;
  undefined1 auVar16 [32];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  long lVar27;
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  bool bVar75;
  bool bVar76;
  bool bVar77;
  bool bVar78;
  bool bVar79;
  bool bVar80;
  bool bVar81;
  bool bVar82;
  float fVar83;
  float fVar84;
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [28];
  uint uVar95;
  uint uVar96;
  uint uVar97;
  ulong uVar98;
  long lVar99;
  ulong uVar100;
  Geometry *pGVar101;
  ulong uVar102;
  undefined4 uVar103;
  undefined8 uVar104;
  float fVar124;
  vint4 bi_2;
  undefined1 auVar110 [16];
  undefined1 auVar105 [16];
  float fVar122;
  float fVar126;
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  float fVar128;
  float fVar129;
  float fVar130;
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  float fVar123;
  float fVar125;
  float fVar127;
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar109 [16];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  vint4 bi_1;
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [64];
  float fVar148;
  float fVar149;
  undefined1 auVar150 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [32];
  undefined1 auVar151 [16];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [64];
  vint4 ai_2;
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [32];
  vint4 ai;
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [32];
  vint4 bi;
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [64];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [64];
  vint4 ai_1;
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [64];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 auVar204 [64];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar209 [64];
  undefined4 uVar210;
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [64];
  float fVar214;
  float fVar220;
  undefined1 auVar215 [16];
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  undefined1 auVar218 [64];
  undefined1 auVar219 [64];
  float fVar226;
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  float fVar227;
  float fVar228;
  float fVar229;
  float fVar230;
  undefined1 auVar225 [64];
  float fVar231;
  float fVar232;
  float fVar233;
  float fVar234;
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  RibbonHit<embree::CatmullRomCurveT<embree::Vec3fx>,_8> bhit;
  int local_7c4;
  Precalculations *local_7c0;
  RayQueryContext *local_7b8;
  Primitive *local_7b0;
  ulong local_7a8;
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  ulong local_748;
  undefined1 local_740 [8];
  float fStack_738;
  float fStack_734;
  float fStack_730;
  float fStack_72c;
  float fStack_728;
  undefined8 local_720;
  undefined8 uStack_718;
  RTCFilterFunctionNArguments local_710;
  undefined1 local_6e0 [32];
  undefined8 local_6c0;
  undefined8 uStack_6b8;
  undefined8 uStack_6b0;
  undefined8 uStack_6a8;
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [48];
  float local_610;
  float fStack_60c;
  float fStack_608;
  float fStack_604;
  undefined8 local_600;
  undefined8 uStack_5f8;
  undefined8 local_5f0;
  undefined8 uStack_5e8;
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined8 local_590;
  undefined4 local_588;
  float local_584;
  undefined4 local_580;
  undefined4 local_57c;
  undefined4 local_578;
  uint local_574;
  uint local_570;
  undefined1 local_560 [32];
  undefined1 local_540 [8];
  undefined8 uStack_538;
  undefined1 auStack_530 [16];
  undefined1 local_520 [32];
  float local_500;
  float fStack_4fc;
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  float fStack_4e4;
  undefined1 local_4e0 [8];
  float fStack_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  undefined1 local_4c0 [8];
  float fStack_4b8;
  float fStack_4b4;
  undefined1 local_4a0 [32];
  undefined1 local_480 [2] [32];
  undefined1 local_440 [8];
  float fStack_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  int local_340;
  int local_33c;
  undefined8 local_330;
  undefined8 uStack_328;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 local_310;
  undefined8 uStack_308;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined1 local_2e0 [32];
  float local_2c0 [4];
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  float fStack_2a4;
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [16];
  undefined1 local_190 [16];
  undefined1 local_180 [32];
  float local_160;
  float fStack_15c;
  float fStack_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  float fStack_144;
  undefined4 local_140;
  undefined4 uStack_13c;
  undefined4 uStack_138;
  undefined4 uStack_134;
  undefined4 uStack_130;
  undefined4 uStack_12c;
  undefined4 uStack_128;
  undefined4 uStack_124;
  float local_120;
  float fStack_11c;
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  undefined1 local_100 [32];
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  undefined1 auVar200 [16];
  
  PVar13 = prim[1];
  uVar102 = (ulong)(byte)PVar13;
  fVar149 = *(float *)(prim + uVar102 * 0x19 + 0x12);
  auVar21 = vsubps_avx((undefined1  [16])(ray->super_RayK<1>).org.field_0,
                       *(undefined1 (*) [16])(prim + uVar102 * 0x19 + 6));
  auVar105._0_4_ = fVar149 * auVar21._0_4_;
  auVar105._4_4_ = fVar149 * auVar21._4_4_;
  auVar105._8_4_ = fVar149 * auVar21._8_4_;
  auVar105._12_4_ = fVar149 * auVar21._12_4_;
  auVar177._0_4_ = fVar149 * (ray->super_RayK<1>).dir.field_0.m128[0];
  auVar177._4_4_ = fVar149 * (ray->super_RayK<1>).dir.field_0.m128[1];
  auVar177._8_4_ = fVar149 * (ray->super_RayK<1>).dir.field_0.m128[2];
  auVar177._12_4_ = fVar149 * (ray->super_RayK<1>).dir.field_0.m128[3];
  auVar21 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar102 * 4 + 6)));
  auVar21 = vcvtdq2ps_avx(auVar21);
  auVar17 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar102 * 5 + 6)));
  auVar17 = vcvtdq2ps_avx(auVar17);
  auVar110 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar102 * 6 + 6)));
  auVar110 = vcvtdq2ps_avx(auVar110);
  auVar18 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar102 * 0xb + 6)));
  auVar18 = vcvtdq2ps_avx(auVar18);
  auVar19 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar13 * 0xc) + 6)));
  auVar19 = vcvtdq2ps_avx(auVar19);
  auVar20 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar13 * 0xc + uVar102 + 6)));
  auVar20 = vcvtdq2ps_avx(auVar20);
  uVar98 = (ulong)(uint)((int)(uVar102 * 9) * 2);
  auVar108 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar98 + 6)));
  auVar108 = vcvtdq2ps_avx(auVar108);
  auVar107 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar98 + uVar102 + 6)));
  auVar107 = vcvtdq2ps_avx(auVar107);
  uVar98 = (ulong)(uint)((int)(uVar102 * 5) << 2);
  auVar150 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar98 + 6)));
  auVar150 = vcvtdq2ps_avx(auVar150);
  auVar221._4_4_ = auVar177._0_4_;
  auVar221._0_4_ = auVar177._0_4_;
  auVar221._8_4_ = auVar177._0_4_;
  auVar221._12_4_ = auVar177._0_4_;
  auVar132 = vshufps_avx(auVar177,auVar177,0x55);
  auVar106 = vshufps_avx(auVar177,auVar177,0xaa);
  fVar149 = auVar106._0_4_;
  auVar211._0_4_ = fVar149 * auVar110._0_4_;
  fVar122 = auVar106._4_4_;
  auVar211._4_4_ = fVar122 * auVar110._4_4_;
  fVar124 = auVar106._8_4_;
  auVar211._8_4_ = fVar124 * auVar110._8_4_;
  fVar126 = auVar106._12_4_;
  auVar211._12_4_ = fVar126 * auVar110._12_4_;
  auVar205._0_4_ = auVar20._0_4_ * fVar149;
  auVar205._4_4_ = auVar20._4_4_ * fVar122;
  auVar205._8_4_ = auVar20._8_4_ * fVar124;
  auVar205._12_4_ = auVar20._12_4_ * fVar126;
  auVar195._0_4_ = auVar150._0_4_ * fVar149;
  auVar195._4_4_ = auVar150._4_4_ * fVar122;
  auVar195._8_4_ = auVar150._8_4_ * fVar124;
  auVar195._12_4_ = auVar150._12_4_ * fVar126;
  auVar106 = vfmadd231ps_fma(auVar211,auVar132,auVar17);
  auVar133 = vfmadd231ps_fma(auVar205,auVar132,auVar19);
  auVar132 = vfmadd231ps_fma(auVar195,auVar107,auVar132);
  auVar163 = vfmadd231ps_fma(auVar106,auVar221,auVar21);
  auVar133 = vfmadd231ps_fma(auVar133,auVar221,auVar18);
  auVar209 = ZEXT1664(auVar133);
  auVar170 = vfmadd231ps_fma(auVar132,auVar108,auVar221);
  auVar222._4_4_ = auVar105._0_4_;
  auVar222._0_4_ = auVar105._0_4_;
  auVar222._8_4_ = auVar105._0_4_;
  auVar222._12_4_ = auVar105._0_4_;
  auVar132 = vshufps_avx(auVar105,auVar105,0x55);
  auVar106 = vshufps_avx(auVar105,auVar105,0xaa);
  fVar149 = auVar106._0_4_;
  auVar178._0_4_ = fVar149 * auVar110._0_4_;
  fVar122 = auVar106._4_4_;
  auVar178._4_4_ = fVar122 * auVar110._4_4_;
  fVar124 = auVar106._8_4_;
  auVar178._8_4_ = fVar124 * auVar110._8_4_;
  fVar126 = auVar106._12_4_;
  auVar178._12_4_ = fVar126 * auVar110._12_4_;
  auVar131._0_4_ = auVar20._0_4_ * fVar149;
  auVar131._4_4_ = auVar20._4_4_ * fVar122;
  auVar131._8_4_ = auVar20._8_4_ * fVar124;
  auVar131._12_4_ = auVar20._12_4_ * fVar126;
  auVar106._0_4_ = auVar150._0_4_ * fVar149;
  auVar106._4_4_ = auVar150._4_4_ * fVar122;
  auVar106._8_4_ = auVar150._8_4_ * fVar124;
  auVar106._12_4_ = auVar150._12_4_ * fVar126;
  auVar17 = vfmadd231ps_fma(auVar178,auVar132,auVar17);
  auVar110 = vfmadd231ps_fma(auVar131,auVar132,auVar19);
  auVar19 = vfmadd231ps_fma(auVar106,auVar132,auVar107);
  auVar20 = vfmadd231ps_fma(auVar17,auVar222,auVar21);
  auVar107 = vfmadd231ps_fma(auVar110,auVar222,auVar18);
  auVar150 = vfmadd231ps_fma(auVar19,auVar222,auVar108);
  local_190._8_4_ = 0x7fffffff;
  local_190._0_8_ = 0x7fffffff7fffffff;
  local_190._12_4_ = 0x7fffffff;
  auVar21 = vandps_avx(auVar163,local_190);
  auVar169._8_4_ = 0x219392ef;
  auVar169._0_8_ = 0x219392ef219392ef;
  auVar169._12_4_ = 0x219392ef;
  auVar21 = vcmpps_avx(auVar21,auVar169,1);
  auVar17 = vblendvps_avx(auVar163,auVar169,auVar21);
  auVar21 = vandps_avx(auVar133,local_190);
  auVar21 = vcmpps_avx(auVar21,auVar169,1);
  auVar110 = vblendvps_avx(auVar133,auVar169,auVar21);
  auVar21 = vandps_avx(auVar170,local_190);
  auVar21 = vcmpps_avx(auVar21,auVar169,1);
  auVar21 = vblendvps_avx(auVar170,auVar169,auVar21);
  auVar18 = vrcpps_avx(auVar17);
  auVar191._8_4_ = 0x3f800000;
  auVar191._0_8_ = &DAT_3f8000003f800000;
  auVar191._12_4_ = 0x3f800000;
  auVar17 = vfnmadd213ps_fma(auVar17,auVar18,auVar191);
  auVar18 = vfmadd132ps_fma(auVar17,auVar18,auVar18);
  auVar17 = vrcpps_avx(auVar110);
  auVar110 = vfnmadd213ps_fma(auVar110,auVar17,auVar191);
  auVar19 = vfmadd132ps_fma(auVar110,auVar17,auVar17);
  auVar17 = vrcpps_avx(auVar21);
  auVar21 = vfnmadd213ps_fma(auVar21,auVar17,auVar191);
  auVar108 = vfmadd132ps_fma(auVar21,auVar17,auVar17);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *(ulong *)(prim + uVar102 * 7 + 6);
  auVar21 = vpmovsxwd_avx(auVar21);
  auVar21 = vcvtdq2ps_avx(auVar21);
  auVar21 = vsubps_avx(auVar21,auVar20);
  auVar170._0_4_ = auVar18._0_4_ * auVar21._0_4_;
  auVar170._4_4_ = auVar18._4_4_ * auVar21._4_4_;
  auVar170._8_4_ = auVar18._8_4_ * auVar21._8_4_;
  auVar170._12_4_ = auVar18._12_4_ * auVar21._12_4_;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar102 * 9 + 6);
  auVar21 = vpmovsxwd_avx(auVar17);
  auVar21 = vcvtdq2ps_avx(auVar21);
  auVar21 = vsubps_avx(auVar21,auVar20);
  auVar179._0_4_ = auVar18._0_4_ * auVar21._0_4_;
  auVar179._4_4_ = auVar18._4_4_ * auVar21._4_4_;
  auVar179._8_4_ = auVar18._8_4_ * auVar21._8_4_;
  auVar179._12_4_ = auVar18._12_4_ * auVar21._12_4_;
  auVar133._1_3_ = 0;
  auVar133[0] = PVar13;
  auVar110._8_8_ = 0;
  auVar110._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar13 * 0x10 + 6);
  auVar17 = vpmovsxwd_avx(auVar110);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar13 * 0x10 + uVar102 * -2 + 6);
  auVar21 = vpmovsxwd_avx(auVar18);
  auVar21 = vcvtdq2ps_avx(auVar21);
  auVar21 = vsubps_avx(auVar21,auVar107);
  auVar196._0_4_ = auVar21._0_4_ * auVar19._0_4_;
  auVar196._4_4_ = auVar21._4_4_ * auVar19._4_4_;
  auVar196._8_4_ = auVar21._8_4_ * auVar19._8_4_;
  auVar196._12_4_ = auVar21._12_4_ * auVar19._12_4_;
  auVar21 = vcvtdq2ps_avx(auVar17);
  auVar21 = vsubps_avx(auVar21,auVar107);
  auVar132._0_4_ = auVar19._0_4_ * auVar21._0_4_;
  auVar132._4_4_ = auVar19._4_4_ * auVar21._4_4_;
  auVar132._8_4_ = auVar19._8_4_ * auVar21._8_4_;
  auVar132._12_4_ = auVar19._12_4_ * auVar21._12_4_;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + uVar98 + uVar102 + 6);
  auVar21 = vpmovsxwd_avx(auVar19);
  auVar21 = vcvtdq2ps_avx(auVar21);
  auVar21 = vsubps_avx(auVar21,auVar150);
  auVar163._0_4_ = auVar108._0_4_ * auVar21._0_4_;
  auVar163._4_4_ = auVar108._4_4_ * auVar21._4_4_;
  auVar163._8_4_ = auVar108._8_4_ * auVar21._8_4_;
  auVar163._12_4_ = auVar108._12_4_ * auVar21._12_4_;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + uVar102 * 0x17 + 6);
  auVar21 = vpmovsxwd_avx(auVar20);
  auVar21 = vcvtdq2ps_avx(auVar21);
  auVar21 = vsubps_avx(auVar21,auVar150);
  auVar107._0_4_ = auVar108._0_4_ * auVar21._0_4_;
  auVar107._4_4_ = auVar108._4_4_ * auVar21._4_4_;
  auVar107._8_4_ = auVar108._8_4_ * auVar21._8_4_;
  auVar107._12_4_ = auVar108._12_4_ * auVar21._12_4_;
  auVar21 = vpminsd_avx(auVar170,auVar179);
  auVar17 = vpminsd_avx(auVar196,auVar132);
  auVar21 = vmaxps_avx(auVar21,auVar17);
  auVar17 = vpminsd_avx(auVar163,auVar107);
  uVar103 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar200._4_4_ = uVar103;
  auVar200._0_4_ = uVar103;
  auVar200._8_4_ = uVar103;
  auVar200._12_4_ = uVar103;
  auVar204 = ZEXT1664(auVar200);
  auVar17 = vmaxps_avx(auVar17,auVar200);
  auVar21 = vmaxps_avx(auVar21,auVar17);
  local_1a0._0_4_ = auVar21._0_4_ * 0.99999964;
  local_1a0._4_4_ = auVar21._4_4_ * 0.99999964;
  local_1a0._8_4_ = auVar21._8_4_ * 0.99999964;
  local_1a0._12_4_ = auVar21._12_4_ * 0.99999964;
  auVar21 = vpmaxsd_avx(auVar170,auVar179);
  auVar17 = vpmaxsd_avx(auVar196,auVar132);
  auVar21 = vminps_avx(auVar21,auVar17);
  auVar17 = vpmaxsd_avx(auVar163,auVar107);
  fVar149 = (ray->super_RayK<1>).tfar;
  auVar150._4_4_ = fVar149;
  auVar150._0_4_ = fVar149;
  auVar150._8_4_ = fVar149;
  auVar150._12_4_ = fVar149;
  auVar17 = vminps_avx(auVar17,auVar150);
  auVar21 = vminps_avx(auVar21,auVar17);
  auVar108._0_4_ = auVar21._0_4_ * 1.0000004;
  auVar108._4_4_ = auVar21._4_4_ * 1.0000004;
  auVar108._8_4_ = auVar21._8_4_ * 1.0000004;
  auVar108._12_4_ = auVar21._12_4_ * 1.0000004;
  auVar133[4] = PVar13;
  auVar133._5_3_ = 0;
  auVar133[8] = PVar13;
  auVar133._9_3_ = 0;
  auVar133[0xc] = PVar13;
  auVar133._13_3_ = 0;
  auVar17 = vpcmpgtd_avx(auVar133,_DAT_01ff0cf0);
  auVar21 = vcmpps_avx(local_1a0,auVar108,2);
  auVar21 = vandps_avx(auVar21,auVar17);
  uVar95 = vmovmskps_avx(auVar21);
  if (uVar95 != 0) {
    uVar95 = uVar95 & 0xff;
    local_480[1]._0_8_ = mm_lookupmask_ps._16_8_;
    local_480[1]._8_8_ = mm_lookupmask_ps._24_8_;
    local_480[1]._16_8_ = mm_lookupmask_ps._16_8_;
    local_480[1]._24_8_ = mm_lookupmask_ps._24_8_;
    do {
      auVar160 = local_3c0;
      local_6e0 = auVar204._0_32_;
      local_660 = auVar209._0_32_;
      lVar27 = 0;
      uVar102 = (ulong)uVar95;
      for (uVar98 = uVar102; (uVar98 & 1) == 0; uVar98 = uVar98 >> 1 | 0x8000000000000000) {
        lVar27 = lVar27 + 1;
      }
      uVar95 = *(uint *)(prim + 2);
      uVar97 = *(uint *)(prim + lVar27 * 4 + 6);
      local_7a8 = (ulong)uVar95;
      pGVar101 = (context->scene->geometries).items[uVar95].ptr;
      local_748 = (ulong)uVar97;
      uVar98 = (ulong)*(uint *)(*(long *)&pGVar101->field_0x58 +
                               pGVar101[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i * (ulong)uVar97);
      p_Var15 = pGVar101[1].intersectionFilterN;
      lVar27 = *(long *)&pGVar101[1].time_range.upper;
      pauVar1 = (undefined1 (*) [16])(lVar27 + (long)p_Var15 * uVar98);
      local_720 = *(undefined8 *)*pauVar1;
      uStack_718 = *(undefined8 *)(*pauVar1 + 8);
      pauVar2 = (undefined1 (*) [16])(lVar27 + (uVar98 + 1) * (long)p_Var15);
      local_5f0 = *(undefined8 *)*pauVar2;
      uStack_5e8 = *(undefined8 *)(*pauVar2 + 8);
      pauVar3 = (undefined1 (*) [16])(lVar27 + (uVar98 + 2) * (long)p_Var15);
      local_600 = *(undefined8 *)*pauVar3;
      uStack_5f8 = *(undefined8 *)(*pauVar3 + 8);
      uVar102 = uVar102 - 1 & uVar102;
      pauVar4 = (undefined1 (*) [16])(lVar27 + (uVar98 + 3) * (long)p_Var15);
      local_300 = *(undefined8 *)*pauVar4;
      uStack_2f8 = *(undefined8 *)(*pauVar4 + 8);
      local_610 = (float)local_300;
      fStack_60c = (float)((ulong)local_300 >> 0x20);
      fStack_608 = (float)uStack_2f8;
      fStack_604 = (float)((ulong)uStack_2f8 >> 0x20);
      if (uVar102 != 0) {
        uVar100 = uVar102 - 1 & uVar102;
        for (uVar98 = uVar102; (uVar98 & 1) == 0; uVar98 = uVar98 >> 1 | 0x8000000000000000) {
        }
        if (uVar100 != 0) {
          for (; (uVar100 & 1) == 0; uVar100 = uVar100 >> 1 | 0x8000000000000000) {
          }
        }
      }
      iVar14 = (int)pGVar101[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      aVar8 = (ray->super_RayK<1>).org.field_0;
      auVar17 = vsubps_avx(*pauVar1,(undefined1  [16])aVar8);
      uVar103 = auVar17._0_4_;
      auVar171._4_4_ = uVar103;
      auVar171._0_4_ = uVar103;
      auVar171._8_4_ = uVar103;
      auVar171._12_4_ = uVar103;
      auVar21 = vshufps_avx(auVar17,auVar17,0x55);
      auVar17 = vshufps_avx(auVar17,auVar17,0xaa);
      aVar9 = (pre->ray_space).vx.field_0;
      aVar10 = (pre->ray_space).vy.field_0;
      fVar149 = (pre->ray_space).vz.field_0.m128[0];
      fVar122 = (pre->ray_space).vz.field_0.m128[1];
      fVar124 = (pre->ray_space).vz.field_0.m128[2];
      fVar126 = (pre->ray_space).vz.field_0.m128[3];
      auVar185._0_4_ = auVar17._0_4_ * fVar149;
      auVar185._4_4_ = auVar17._4_4_ * fVar122;
      auVar185._8_4_ = auVar17._8_4_ * fVar124;
      auVar185._12_4_ = auVar17._12_4_ * fVar126;
      auVar21 = vfmadd231ps_fma(auVar185,(undefined1  [16])aVar10,auVar21);
      auVar20 = vfmadd231ps_fma(auVar21,(undefined1  [16])aVar9,auVar171);
      auVar21 = vblendps_avx(auVar20,*pauVar1,8);
      auVar110 = vsubps_avx(*pauVar2,(undefined1  [16])aVar8);
      uVar103 = auVar110._0_4_;
      auVar186._4_4_ = uVar103;
      auVar186._0_4_ = uVar103;
      auVar186._8_4_ = uVar103;
      auVar186._12_4_ = uVar103;
      auVar17 = vshufps_avx(auVar110,auVar110,0x55);
      auVar110 = vshufps_avx(auVar110,auVar110,0xaa);
      auVar206._0_4_ = auVar110._0_4_ * fVar149;
      auVar206._4_4_ = auVar110._4_4_ * fVar122;
      auVar206._8_4_ = auVar110._8_4_ * fVar124;
      auVar206._12_4_ = auVar110._12_4_ * fVar126;
      auVar17 = vfmadd231ps_fma(auVar206,(undefined1  [16])aVar10,auVar17);
      auVar108 = vfmadd231ps_fma(auVar17,(undefined1  [16])aVar9,auVar186);
      auVar17 = vblendps_avx(auVar108,*pauVar2,8);
      auVar18 = vsubps_avx(*pauVar3,(undefined1  [16])aVar8);
      uVar103 = auVar18._0_4_;
      auVar192._4_4_ = uVar103;
      auVar192._0_4_ = uVar103;
      auVar192._8_4_ = uVar103;
      auVar192._12_4_ = uVar103;
      auVar110 = vshufps_avx(auVar18,auVar18,0x55);
      auVar18 = vshufps_avx(auVar18,auVar18,0xaa);
      auVar212._0_4_ = auVar18._0_4_ * fVar149;
      auVar212._4_4_ = auVar18._4_4_ * fVar122;
      auVar212._8_4_ = auVar18._8_4_ * fVar124;
      auVar212._12_4_ = auVar18._12_4_ * fVar126;
      auVar110 = vfmadd231ps_fma(auVar212,(undefined1  [16])aVar10,auVar110);
      auVar107 = vfmadd231ps_fma(auVar110,(undefined1  [16])aVar9,auVar192);
      auVar110 = vblendps_avx(auVar107,*pauVar3,8);
      auVar88._12_4_ = fStack_604;
      auVar88._0_12_ = *(undefined1 (*) [12])*pauVar4;
      auVar19 = vsubps_avx(auVar88,(undefined1  [16])aVar8);
      uVar103 = auVar19._0_4_;
      auVar193._4_4_ = uVar103;
      auVar193._0_4_ = uVar103;
      auVar193._8_4_ = uVar103;
      auVar193._12_4_ = uVar103;
      auVar18 = vshufps_avx(auVar19,auVar19,0x55);
      auVar19 = vshufps_avx(auVar19,auVar19,0xaa);
      auVar215._0_4_ = auVar19._0_4_ * fVar149;
      auVar215._4_4_ = auVar19._4_4_ * fVar122;
      auVar215._8_4_ = auVar19._8_4_ * fVar124;
      auVar215._12_4_ = auVar19._12_4_ * fVar126;
      auVar18 = vfmadd231ps_fma(auVar215,(undefined1  [16])aVar10,auVar18);
      auVar150 = vfmadd231ps_fma(auVar18,(undefined1  [16])aVar9,auVar193);
      auVar18 = vblendps_avx(auVar150,auVar88,8);
      auVar21 = vandps_avx(auVar21,local_190);
      auVar17 = vandps_avx(auVar17,local_190);
      auVar19 = vmaxps_avx(auVar21,auVar17);
      auVar21 = vandps_avx(auVar110,local_190);
      auVar17 = vandps_avx(auVar18,local_190);
      auVar21 = vmaxps_avx(auVar21,auVar17);
      auVar21 = vmaxps_avx(auVar19,auVar21);
      auVar17 = vmovshdup_avx(auVar21);
      auVar17 = vmaxss_avx(auVar17,auVar21);
      auVar21 = vshufpd_avx(auVar21,auVar21,1);
      auVar21 = vmaxss_avx(auVar21,auVar17);
      lVar27 = (long)iVar14 * 0x44;
      auVar17 = vmovshdup_avx(auVar20);
      uVar104 = auVar17._0_8_;
      local_4a0._8_8_ = uVar104;
      local_4a0._0_8_ = uVar104;
      local_4a0._16_8_ = uVar104;
      local_4a0._24_8_ = uVar104;
      auVar11 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar27 + 0x484);
      auVar17 = vmovshdup_avx(auVar108);
      uVar104 = auVar17._0_8_;
      local_520._8_8_ = uVar104;
      local_520._0_8_ = uVar104;
      local_520._16_8_ = uVar104;
      local_520._24_8_ = uVar104;
      auVar184 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar27 + 0x908);
      uVar210 = auVar107._0_4_;
      local_680._4_4_ = uVar210;
      local_680._0_4_ = uVar210;
      local_680._8_4_ = uVar210;
      local_680._12_4_ = uVar210;
      local_680._16_4_ = uVar210;
      local_680._20_4_ = uVar210;
      local_680._24_4_ = uVar210;
      local_680._28_4_ = uVar210;
      auVar17 = vmovshdup_avx(auVar107);
      uVar104 = auVar17._0_8_;
      local_6a0._8_8_ = uVar104;
      local_6a0._0_8_ = uVar104;
      local_6a0._16_8_ = uVar104;
      local_6a0._24_8_ = uVar104;
      fVar122 = *(float *)*(undefined1 (*) [28])(catmullrom_basis0 + lVar27 + 0xd8c);
      fVar124 = *(float *)(catmullrom_basis0 + lVar27 + 0xd90);
      fVar126 = *(float *)(catmullrom_basis0 + lVar27 + 0xd94);
      fVar233 = *(float *)(catmullrom_basis0 + lVar27 + 0xd98);
      fVar234 = *(float *)(catmullrom_basis0 + lVar27 + 0xd9c);
      fVar148 = *(float *)(catmullrom_basis0 + lVar27 + 0xda0);
      fVar123 = *(float *)(catmullrom_basis0 + lVar27 + 0xda4);
      auVar94 = *(undefined1 (*) [28])(catmullrom_basis0 + lVar27 + 0xd8c);
      local_500 = auVar150._0_4_;
      auVar17 = vmovshdup_avx(auVar150);
      local_6c0 = auVar17._0_8_;
      auVar140._0_4_ = fVar122 * local_500;
      auVar140._4_4_ = fVar124 * local_500;
      auVar140._8_4_ = fVar126 * local_500;
      auVar140._12_4_ = fVar233 * local_500;
      auVar140._16_4_ = fVar234 * local_500;
      auVar140._20_4_ = fVar148 * local_500;
      auVar140._24_4_ = fVar123 * local_500;
      auVar140._28_4_ = 0;
      fVar231 = auVar17._0_4_;
      auVar111._0_4_ = fVar231 * fVar122;
      fVar232 = auVar17._4_4_;
      auVar111._4_4_ = fVar232 * fVar124;
      auVar111._8_4_ = fVar231 * fVar126;
      auVar111._12_4_ = fVar232 * fVar233;
      auVar111._16_4_ = fVar231 * fVar234;
      auVar111._20_4_ = fVar232 * fVar148;
      auVar111._24_4_ = fVar231 * fVar123;
      auVar111._28_4_ = 0;
      auVar17 = vfmadd231ps_fma(auVar140,auVar184,local_680);
      auVar110 = vfmadd231ps_fma(auVar111,auVar184,local_6a0);
      uVar103 = auVar108._0_4_;
      local_5e0._4_4_ = uVar103;
      local_5e0._0_4_ = uVar103;
      local_5e0._8_4_ = uVar103;
      local_5e0._12_4_ = uVar103;
      local_5e0._16_4_ = uVar103;
      local_5e0._20_4_ = uVar103;
      local_5e0._24_4_ = uVar103;
      local_5e0._28_4_ = uVar103;
      auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar11,local_5e0);
      auVar110 = vfmadd231ps_fma(ZEXT1632(auVar110),auVar11,local_520);
      auVar111 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar27);
      uVar103 = auVar20._0_4_;
      local_5c0._4_4_ = uVar103;
      local_5c0._0_4_ = uVar103;
      local_5c0._8_4_ = uVar103;
      local_5c0._12_4_ = uVar103;
      local_5c0._16_4_ = uVar103;
      local_5c0._20_4_ = uVar103;
      local_5c0._24_4_ = uVar103;
      local_5c0._28_4_ = uVar103;
      auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar111,local_5c0);
      auVar110 = vfmadd231ps_fma(ZEXT1632(auVar110),auVar111,local_4a0);
      auVar140 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar27 + 0x908);
      fVar125 = *(float *)(catmullrom_basis1 + lVar27 + 0xd8c);
      fVar127 = *(float *)(catmullrom_basis1 + lVar27 + 0xd90);
      fVar128 = *(float *)(catmullrom_basis1 + lVar27 + 0xd94);
      fVar129 = *(float *)(catmullrom_basis1 + lVar27 + 0xd98);
      fVar130 = *(float *)(catmullrom_basis1 + lVar27 + 0xd9c);
      fVar83 = *(float *)(catmullrom_basis1 + lVar27 + 0xda0);
      fVar84 = *(float *)(catmullrom_basis1 + lVar27 + 0xda4);
      fStack_4fc = local_500;
      fStack_4f8 = local_500;
      fStack_4f4 = local_500;
      fStack_4f0 = local_500;
      fStack_4ec = local_500;
      fStack_4e8 = local_500;
      fStack_4e4 = local_500;
      auVar12._4_4_ = fVar127 * local_500;
      auVar12._0_4_ = fVar125 * local_500;
      auVar12._8_4_ = fVar128 * local_500;
      auVar12._12_4_ = fVar129 * local_500;
      auVar12._16_4_ = fVar130 * local_500;
      auVar12._20_4_ = fVar83 * local_500;
      auVar12._24_4_ = fVar84 * local_500;
      auVar12._28_4_ = local_500;
      auVar18 = vfmadd231ps_fma(auVar12,auVar140,local_680);
      uStack_6b8 = local_6c0;
      uStack_6b0 = local_6c0;
      uStack_6a8 = local_6c0;
      auVar119._4_4_ = fVar232 * fVar127;
      auVar119._0_4_ = fVar231 * fVar125;
      auVar119._8_4_ = fVar231 * fVar128;
      auVar119._12_4_ = fVar232 * fVar129;
      auVar119._16_4_ = fVar231 * fVar130;
      auVar119._20_4_ = fVar232 * fVar83;
      auVar119._24_4_ = fVar231 * fVar84;
      auVar119._28_4_ = uVar210;
      auVar19 = vfmadd231ps_fma(auVar119,auVar140,local_6a0);
      auVar12 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar27 + 0x484);
      auVar18 = vfmadd231ps_fma(ZEXT1632(auVar18),auVar12,local_5e0);
      auVar19 = vfmadd231ps_fma(ZEXT1632(auVar19),auVar12,local_520);
      auVar119 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar27);
      auVar18 = vfmadd231ps_fma(ZEXT1632(auVar18),auVar119,local_5c0);
      auVar19 = vfmadd231ps_fma(ZEXT1632(auVar19),auVar119,local_4a0);
      local_1c0 = ZEXT1632(auVar18);
      local_200 = ZEXT1632(auVar17);
      auVar22 = vsubps_avx(local_1c0,local_200);
      local_1e0 = ZEXT1632(auVar19);
      auVar112 = ZEXT1632(auVar110);
      auVar23 = vsubps_avx(local_1e0,auVar112);
      auVar113._0_4_ = auVar110._0_4_ * auVar22._0_4_;
      auVar113._4_4_ = auVar110._4_4_ * auVar22._4_4_;
      auVar113._8_4_ = auVar110._8_4_ * auVar22._8_4_;
      auVar113._12_4_ = auVar110._12_4_ * auVar22._12_4_;
      auVar113._16_4_ = auVar22._16_4_ * 0.0;
      auVar113._20_4_ = auVar22._20_4_ * 0.0;
      auVar113._24_4_ = auVar22._24_4_ * 0.0;
      auVar113._28_4_ = 0;
      fVar214 = auVar23._0_4_;
      auVar136._0_4_ = fVar214 * auVar17._0_4_;
      fVar220 = auVar23._4_4_;
      auVar136._4_4_ = fVar220 * auVar17._4_4_;
      fVar226 = auVar23._8_4_;
      auVar136._8_4_ = fVar226 * auVar17._8_4_;
      fVar227 = auVar23._12_4_;
      auVar136._12_4_ = fVar227 * auVar17._12_4_;
      fVar228 = auVar23._16_4_;
      auVar136._16_4_ = fVar228 * 0.0;
      fVar229 = auVar23._20_4_;
      auVar136._20_4_ = fVar229 * 0.0;
      fVar230 = auVar23._24_4_;
      auVar136._24_4_ = fVar230 * 0.0;
      auVar136._28_4_ = 0;
      auVar113 = vsubps_avx(auVar113,auVar136);
      auVar17 = vpermilps_avx(*pauVar1,0xff);
      uVar104 = auVar17._0_8_;
      local_80._8_8_ = uVar104;
      local_80._0_8_ = uVar104;
      local_80._16_8_ = uVar104;
      local_80._24_8_ = uVar104;
      auVar110 = vpermilps_avx(*pauVar2,0xff);
      uVar104 = auVar110._0_8_;
      local_a0._8_8_ = uVar104;
      local_a0._0_8_ = uVar104;
      local_a0._16_8_ = uVar104;
      local_a0._24_8_ = uVar104;
      auVar110 = vpermilps_avx(*pauVar3,0xff);
      uVar104 = auVar110._0_8_;
      local_c0._8_8_ = uVar104;
      local_c0._0_8_ = uVar104;
      local_c0._16_8_ = uVar104;
      local_c0._24_8_ = uVar104;
      auVar89._12_4_ = fStack_604;
      auVar89._0_12_ = *(undefined1 (*) [12])*pauVar4;
      auVar110 = vpermilps_avx(auVar89,0xff);
      local_e0 = auVar110._0_8_;
      fVar149 = auVar110._0_4_;
      auVar187._0_4_ = fVar122 * fVar149;
      fVar122 = auVar110._4_4_;
      auVar187._4_4_ = fVar124 * fVar122;
      auVar187._8_4_ = fVar126 * fVar149;
      auVar187._12_4_ = fVar233 * fVar122;
      auVar187._16_4_ = fVar234 * fVar149;
      auVar187._20_4_ = fVar148 * fVar122;
      auVar187._24_4_ = fVar123 * fVar149;
      auVar187._28_4_ = 0;
      auVar110 = vfmadd231ps_fma(auVar187,local_c0,auVar184);
      auVar110 = vfmadd231ps_fma(ZEXT1632(auVar110),local_a0,auVar11);
      auVar18 = vfmadd231ps_fma(ZEXT1632(auVar110),auVar111,local_80);
      uStack_d8 = local_e0;
      uStack_d0 = local_e0;
      uStack_c8 = local_e0;
      auVar16._4_4_ = fVar127 * fVar122;
      auVar16._0_4_ = fVar125 * fVar149;
      auVar16._8_4_ = fVar128 * fVar149;
      auVar16._12_4_ = fVar129 * fVar122;
      auVar16._16_4_ = fVar130 * fVar149;
      auVar16._20_4_ = fVar83 * fVar122;
      auVar16._24_4_ = fVar84 * fVar149;
      auVar16._28_4_ = auVar111._28_4_;
      auVar110 = vfmadd231ps_fma(auVar16,auVar140,local_c0);
      auVar110 = vfmadd231ps_fma(ZEXT1632(auVar110),auVar12,local_a0);
      auVar19 = vfmadd231ps_fma(ZEXT1632(auVar110),auVar119,local_80);
      auVar26._4_4_ = fVar220 * fVar220;
      auVar26._0_4_ = fVar214 * fVar214;
      auVar26._8_4_ = fVar226 * fVar226;
      auVar26._12_4_ = fVar227 * fVar227;
      auVar26._16_4_ = fVar228 * fVar228;
      auVar26._20_4_ = fVar229 * fVar229;
      auVar26._24_4_ = fVar230 * fVar230;
      auVar26._28_4_ = auVar17._4_4_;
      auVar17 = vfmadd231ps_fma(auVar26,auVar22,auVar22);
      auVar16 = vmaxps_avx(ZEXT1632(auVar18),ZEXT1632(auVar19));
      auVar24._4_4_ = auVar16._4_4_ * auVar16._4_4_ * auVar17._4_4_;
      auVar24._0_4_ = auVar16._0_4_ * auVar16._0_4_ * auVar17._0_4_;
      auVar24._8_4_ = auVar16._8_4_ * auVar16._8_4_ * auVar17._8_4_;
      auVar24._12_4_ = auVar16._12_4_ * auVar16._12_4_ * auVar17._12_4_;
      auVar24._16_4_ = auVar16._16_4_ * auVar16._16_4_ * 0.0;
      auVar24._20_4_ = auVar16._20_4_ * auVar16._20_4_ * 0.0;
      auVar24._24_4_ = auVar16._24_4_ * auVar16._24_4_ * 0.0;
      auVar24._28_4_ = auVar16._28_4_;
      auVar25._4_4_ = auVar113._4_4_ * auVar113._4_4_;
      auVar25._0_4_ = auVar113._0_4_ * auVar113._0_4_;
      auVar25._8_4_ = auVar113._8_4_ * auVar113._8_4_;
      auVar25._12_4_ = auVar113._12_4_ * auVar113._12_4_;
      auVar25._16_4_ = auVar113._16_4_ * auVar113._16_4_;
      auVar25._20_4_ = auVar113._20_4_ * auVar113._20_4_;
      auVar25._24_4_ = auVar113._24_4_ * auVar113._24_4_;
      auVar25._28_4_ = auVar113._28_4_;
      auVar16 = vcmpps_avx(auVar25,auVar24,2);
      auVar162 = ZEXT3264(auVar16);
      fVar149 = auVar21._0_4_ * 4.7683716e-07;
      _local_740 = ZEXT416((uint)fVar149);
      auVar114._0_4_ = (float)iVar14;
      local_3c0._4_12_ = auVar107._4_12_;
      local_3c0._0_4_ = auVar114._0_4_;
      local_3c0._16_16_ = auVar160._16_16_;
      auVar114._4_4_ = auVar114._0_4_;
      auVar114._8_4_ = auVar114._0_4_;
      auVar114._12_4_ = auVar114._0_4_;
      auVar114._16_4_ = auVar114._0_4_;
      auVar114._20_4_ = auVar114._0_4_;
      auVar114._24_4_ = auVar114._0_4_;
      auVar114._28_4_ = auVar114._0_4_;
      auVar160 = vcmpps_avx(_DAT_02020f40,auVar114,1);
      auVar17 = vpermilps_avx(auVar20,0xaa);
      uVar104 = auVar17._0_8_;
      local_420._8_8_ = uVar104;
      local_420._0_8_ = uVar104;
      local_420._16_8_ = uVar104;
      local_420._24_8_ = uVar104;
      auVar110 = vpermilps_avx(auVar108,0xaa);
      uVar104 = auVar110._0_8_;
      local_400._8_8_ = uVar104;
      local_400._0_8_ = uVar104;
      local_400._16_8_ = uVar104;
      local_400._24_8_ = uVar104;
      auVar21 = vshufps_avx(auVar107,auVar107,0xaa);
      uVar104 = auVar21._0_8_;
      local_180._8_8_ = uVar104;
      local_180._0_8_ = uVar104;
      local_180._16_8_ = uVar104;
      local_180._24_8_ = uVar104;
      auVar21 = vshufps_avx(auVar150,auVar150,0xaa);
      uVar104 = auVar21._0_8_;
      register0x00001508 = uVar104;
      local_4e0 = uVar104;
      register0x00001510 = uVar104;
      register0x00001518 = uVar104;
      auVar218 = ZEXT3264(_local_4e0);
      auVar113 = auVar160 & auVar16;
      uVar7 = *(uint *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
      _local_540 = ZEXT416(uVar7);
      fVar122 = fVar231;
      fVar124 = fVar232;
      fVar126 = fVar231;
      fVar233 = fVar232;
      fVar234 = fVar231;
      if ((((((((auVar113 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar113 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar113 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar113 >> 0x7f,0) == '\0') &&
            (auVar113 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar113 >> 0xbf,0) == '\0') &&
          (auVar113 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar113[0x1f]) {
        auVar209 = ZEXT3264(local_660);
        auVar204 = ZEXT3264(local_6e0);
        auVar147 = ZEXT3264(local_520);
        auVar213 = ZEXT3264(local_680);
        auVar225 = ZEXT3264(local_6a0);
        auVar194 = ZEXT3264(CONCAT428(local_500,
                                      CONCAT424(local_500,
                                                CONCAT420(local_500,
                                                          CONCAT416(local_500,
                                                                    CONCAT412(local_500,
                                                                              CONCAT48(local_500,
                                                                                       CONCAT44(
                                                  local_500,local_500))))))));
        auVar199 = ZEXT3264(local_5e0);
        auVar190 = ZEXT3264(local_5c0);
      }
      else {
        local_220 = vandps_avx(auVar16,auVar160);
        fVar214 = auVar21._0_4_;
        fVar220 = auVar21._4_4_;
        auVar160._4_4_ = fVar220 * fVar127;
        auVar160._0_4_ = fVar214 * fVar125;
        auVar160._8_4_ = fVar214 * fVar128;
        auVar160._12_4_ = fVar220 * fVar129;
        auVar160._16_4_ = fVar214 * fVar130;
        auVar160._20_4_ = fVar220 * fVar83;
        auVar160._24_4_ = fVar214 * fVar84;
        auVar160._28_4_ = local_220._28_4_;
        auVar21 = vfmadd213ps_fma(auVar140,local_180,auVar160);
        auVar21 = vfmadd213ps_fma(auVar12,local_400,ZEXT1632(auVar21));
        auVar21 = vfmadd213ps_fma(auVar119,local_420,ZEXT1632(auVar21));
        local_440._0_4_ = auVar94._0_4_;
        local_440._4_4_ = auVar94._4_4_;
        fStack_438 = auVar94._8_4_;
        fStack_434 = auVar94._12_4_;
        fStack_430 = auVar94._16_4_;
        fStack_42c = auVar94._20_4_;
        fStack_428 = auVar94._24_4_;
        auVar115._0_4_ = fVar214 * (float)local_440._0_4_;
        auVar115._4_4_ = fVar220 * (float)local_440._4_4_;
        auVar115._8_4_ = fVar214 * fStack_438;
        auVar115._12_4_ = fVar220 * fStack_434;
        auVar115._16_4_ = fVar214 * fStack_430;
        auVar115._20_4_ = fVar220 * fStack_42c;
        auVar115._24_4_ = fVar214 * fStack_428;
        auVar115._28_4_ = 0;
        auVar20 = vfmadd213ps_fma(auVar184,local_180,auVar115);
        auVar20 = vfmadd213ps_fma(auVar11,local_400,ZEXT1632(auVar20));
        auVar160 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar27 + 0x1210);
        auVar11 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar27 + 0x1694);
        auVar184 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar27 + 0x1b18);
        fVar148 = *(float *)(catmullrom_basis0 + lVar27 + 0x1f9c);
        fVar123 = *(float *)(catmullrom_basis0 + lVar27 + 0x1fa0);
        fVar125 = *(float *)(catmullrom_basis0 + lVar27 + 0x1fa4);
        fVar127 = *(float *)(catmullrom_basis0 + lVar27 + 0x1fa8);
        fVar128 = *(float *)(catmullrom_basis0 + lVar27 + 0x1fac);
        fVar129 = *(float *)(catmullrom_basis0 + lVar27 + 0x1fb0);
        fVar130 = *(float *)(catmullrom_basis0 + lVar27 + 0x1fb4);
        auVar180._0_4_ = local_500 * fVar148;
        auVar180._4_4_ = local_500 * fVar123;
        auVar180._8_4_ = local_500 * fVar125;
        auVar180._12_4_ = local_500 * fVar127;
        auVar180._16_4_ = local_500 * fVar128;
        auVar180._20_4_ = local_500 * fVar129;
        auVar180._24_4_ = local_500 * fVar130;
        auVar180._28_4_ = 0;
        auVar28._4_4_ = fVar232 * fVar123;
        auVar28._0_4_ = fVar231 * fVar148;
        auVar28._8_4_ = fVar231 * fVar125;
        auVar28._12_4_ = fVar232 * fVar127;
        auVar28._16_4_ = fVar231 * fVar128;
        auVar28._20_4_ = fVar232 * fVar129;
        auVar28._24_4_ = fVar231 * fVar130;
        auVar28._28_4_ = auVar110._4_4_;
        auVar29._4_4_ = fVar220 * fVar123;
        auVar29._0_4_ = fVar214 * fVar148;
        auVar29._8_4_ = fVar214 * fVar125;
        auVar29._12_4_ = fVar220 * fVar127;
        auVar29._16_4_ = fVar214 * fVar128;
        auVar29._20_4_ = fVar220 * fVar129;
        auVar29._24_4_ = fVar214 * fVar130;
        auVar29._28_4_ = fVar220;
        auVar110 = vfmadd231ps_fma(auVar180,auVar184,local_680);
        auVar108 = vfmadd231ps_fma(auVar28,auVar184,local_6a0);
        auVar107 = vfmadd231ps_fma(auVar29,local_180,auVar184);
        auVar110 = vfmadd231ps_fma(ZEXT1632(auVar110),auVar11,local_5e0);
        auVar108 = vfmadd231ps_fma(ZEXT1632(auVar108),auVar11,local_520);
        auVar107 = vfmadd231ps_fma(ZEXT1632(auVar107),auVar11,local_400);
        _local_440 = auVar23;
        auVar110 = vfmadd231ps_fma(ZEXT1632(auVar110),auVar160,local_5c0);
        auVar108 = vfmadd231ps_fma(ZEXT1632(auVar108),auVar160,local_4a0);
        auVar107 = vfmadd231ps_fma(ZEXT1632(auVar107),local_420,auVar160);
        fVar148 = *(float *)(catmullrom_basis1 + lVar27 + 0x1f9c);
        fVar123 = *(float *)(catmullrom_basis1 + lVar27 + 0x1fa0);
        fVar125 = *(float *)(catmullrom_basis1 + lVar27 + 0x1fa4);
        fVar127 = *(float *)(catmullrom_basis1 + lVar27 + 0x1fa8);
        fVar128 = *(float *)(catmullrom_basis1 + lVar27 + 0x1fac);
        fVar129 = *(float *)(catmullrom_basis1 + lVar27 + 0x1fb0);
        fVar130 = *(float *)(catmullrom_basis1 + lVar27 + 0x1fb4);
        auVar11._4_4_ = local_500 * fVar123;
        auVar11._0_4_ = local_500 * fVar148;
        auVar11._8_4_ = local_500 * fVar125;
        auVar11._12_4_ = local_500 * fVar127;
        auVar11._16_4_ = local_500 * fVar128;
        auVar11._20_4_ = local_500 * fVar129;
        auVar11._24_4_ = local_500 * fVar130;
        auVar11._28_4_ = auVar160._28_4_;
        auVar184._4_4_ = fVar232 * fVar123;
        auVar184._0_4_ = fVar231 * fVar148;
        auVar184._8_4_ = fVar231 * fVar125;
        auVar184._12_4_ = fVar232 * fVar127;
        auVar184._16_4_ = fVar231 * fVar128;
        auVar184._20_4_ = fVar232 * fVar129;
        auVar184._24_4_ = fVar231 * fVar130;
        auVar184._28_4_ = fVar232;
        auVar30._4_4_ = fVar123 * fVar220;
        auVar30._0_4_ = fVar148 * fVar214;
        auVar30._8_4_ = fVar125 * fVar214;
        auVar30._12_4_ = fVar127 * fVar220;
        auVar30._16_4_ = fVar128 * fVar214;
        auVar30._20_4_ = fVar129 * fVar220;
        auVar30._24_4_ = fVar130 * fVar214;
        auVar30._28_4_ = auVar17._4_4_;
        auVar160 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar27 + 0x1b18);
        auVar17 = vfmadd231ps_fma(auVar11,auVar160,local_680);
        auVar150 = vfmadd231ps_fma(auVar184,auVar160,local_6a0);
        auVar132 = vfmadd231ps_fma(auVar30,auVar160,local_180);
        auVar160 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar27 + 0x1694);
        auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar160,local_5e0);
        auVar150 = vfmadd231ps_fma(ZEXT1632(auVar150),auVar160,local_520);
        auVar132 = vfmadd231ps_fma(ZEXT1632(auVar132),local_400,auVar160);
        auVar160 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar27 + 0x1210);
        auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar160,local_5c0);
        auVar150 = vfmadd231ps_fma(ZEXT1632(auVar150),auVar160,local_4a0);
        auVar137._8_4_ = 0x7fffffff;
        auVar137._0_8_ = 0x7fffffff7fffffff;
        auVar137._12_4_ = 0x7fffffff;
        auVar137._16_4_ = 0x7fffffff;
        auVar137._20_4_ = 0x7fffffff;
        auVar137._24_4_ = 0x7fffffff;
        auVar137._28_4_ = 0x7fffffff;
        auVar132 = vfmadd231ps_fma(ZEXT1632(auVar132),local_420,auVar160);
        auVar160 = vandps_avx(ZEXT1632(auVar110),auVar137);
        auVar11 = vandps_avx(ZEXT1632(auVar108),auVar137);
        auVar11 = vmaxps_avx(auVar160,auVar11);
        auVar160 = vandps_avx(ZEXT1632(auVar107),auVar137);
        auVar160 = vmaxps_avx(auVar11,auVar160);
        auVar157._4_4_ = fVar149;
        auVar157._0_4_ = fVar149;
        auVar157._8_4_ = fVar149;
        auVar157._12_4_ = fVar149;
        auVar157._16_4_ = fVar149;
        auVar157._20_4_ = fVar149;
        auVar157._24_4_ = fVar149;
        auVar157._28_4_ = fVar149;
        auVar160 = vcmpps_avx(auVar160,auVar157,1);
        auVar184 = vblendvps_avx(ZEXT1632(auVar110),auVar22,auVar160);
        auVar140 = vblendvps_avx(ZEXT1632(auVar108),auVar23,auVar160);
        auVar160 = vandps_avx(ZEXT1632(auVar17),auVar137);
        auVar11 = vandps_avx(ZEXT1632(auVar150),auVar137);
        auVar12 = vmaxps_avx(auVar160,auVar11);
        auVar160 = vandps_avx(ZEXT1632(auVar132),auVar137);
        auVar160 = vmaxps_avx(auVar12,auVar160);
        auVar119 = vcmpps_avx(auVar160,auVar157,1);
        auVar160 = vblendvps_avx(ZEXT1632(auVar17),auVar22,auVar119);
        auVar12 = vblendvps_avx(ZEXT1632(auVar150),auVar23,auVar119);
        auVar17 = vfmadd213ps_fma(auVar111,local_420,ZEXT1632(auVar20));
        auVar110 = vfmadd213ps_fma(auVar184,auVar184,ZEXT832(0) << 0x20);
        auVar110 = vfmadd231ps_fma(ZEXT1632(auVar110),auVar140,auVar140);
        auVar111 = vrsqrtps_avx(ZEXT1632(auVar110));
        fVar148 = auVar111._0_4_;
        fVar123 = auVar111._4_4_;
        fVar125 = auVar111._8_4_;
        fVar127 = auVar111._12_4_;
        fVar128 = auVar111._16_4_;
        fVar129 = auVar111._20_4_;
        fVar130 = auVar111._24_4_;
        auVar22._4_4_ = fVar123 * fVar123 * fVar123 * auVar110._4_4_ * -0.5;
        auVar22._0_4_ = fVar148 * fVar148 * fVar148 * auVar110._0_4_ * -0.5;
        auVar22._8_4_ = fVar125 * fVar125 * fVar125 * auVar110._8_4_ * -0.5;
        auVar22._12_4_ = fVar127 * fVar127 * fVar127 * auVar110._12_4_ * -0.5;
        auVar22._16_4_ = fVar128 * fVar128 * fVar128 * -0.0;
        auVar22._20_4_ = fVar129 * fVar129 * fVar129 * -0.0;
        auVar22._24_4_ = fVar130 * fVar130 * fVar130 * -0.0;
        auVar22._28_4_ = auVar11._28_4_;
        auVar223._8_4_ = 0x3fc00000;
        auVar223._0_8_ = 0x3fc000003fc00000;
        auVar223._12_4_ = 0x3fc00000;
        auVar223._16_4_ = 0x3fc00000;
        auVar223._20_4_ = 0x3fc00000;
        auVar223._24_4_ = 0x3fc00000;
        auVar223._28_4_ = 0x3fc00000;
        auVar110 = vfmadd231ps_fma(auVar22,auVar223,auVar111);
        fVar148 = auVar110._0_4_;
        fVar123 = auVar110._4_4_;
        auVar23._4_4_ = fVar123 * auVar140._4_4_;
        auVar23._0_4_ = fVar148 * auVar140._0_4_;
        fVar125 = auVar110._8_4_;
        auVar23._8_4_ = fVar125 * auVar140._8_4_;
        fVar127 = auVar110._12_4_;
        auVar23._12_4_ = fVar127 * auVar140._12_4_;
        auVar23._16_4_ = auVar140._16_4_ * 0.0;
        auVar23._20_4_ = auVar140._20_4_ * 0.0;
        auVar23._24_4_ = auVar140._24_4_ * 0.0;
        auVar23._28_4_ = 0;
        auVar31._4_4_ = fVar123 * -auVar184._4_4_;
        auVar31._0_4_ = fVar148 * -auVar184._0_4_;
        auVar31._8_4_ = fVar125 * -auVar184._8_4_;
        auVar31._12_4_ = fVar127 * -auVar184._12_4_;
        auVar31._16_4_ = -auVar184._16_4_ * 0.0;
        auVar31._20_4_ = -auVar184._20_4_ * 0.0;
        auVar31._24_4_ = -auVar184._24_4_ * 0.0;
        auVar31._28_4_ = auVar111._28_4_;
        auVar110 = vfmadd213ps_fma(auVar160,auVar160,ZEXT832(0) << 0x20);
        auVar110 = vfmadd231ps_fma(ZEXT1632(auVar110),auVar12,auVar12);
        auVar11 = vrsqrtps_avx(ZEXT1632(auVar110));
        auVar32._28_4_ = auVar119._28_4_;
        auVar32._0_28_ =
             ZEXT1628(CONCAT412(fVar127 * 0.0,
                                CONCAT48(fVar125 * 0.0,CONCAT44(fVar123 * 0.0,fVar148 * 0.0))));
        fVar148 = auVar11._0_4_;
        fVar123 = auVar11._4_4_;
        fVar125 = auVar11._8_4_;
        fVar127 = auVar11._12_4_;
        fVar128 = auVar11._16_4_;
        fVar129 = auVar11._20_4_;
        fVar130 = auVar11._24_4_;
        auVar33._4_4_ = fVar123 * fVar123 * fVar123 * auVar110._4_4_ * -0.5;
        auVar33._0_4_ = fVar148 * fVar148 * fVar148 * auVar110._0_4_ * -0.5;
        auVar33._8_4_ = fVar125 * fVar125 * fVar125 * auVar110._8_4_ * -0.5;
        auVar33._12_4_ = fVar127 * fVar127 * fVar127 * auVar110._12_4_ * -0.5;
        auVar33._16_4_ = fVar128 * fVar128 * fVar128 * -0.0;
        auVar33._20_4_ = fVar129 * fVar129 * fVar129 * -0.0;
        auVar33._24_4_ = fVar130 * fVar130 * fVar130 * -0.0;
        auVar33._28_4_ = 0;
        auVar110 = vfmadd231ps_fma(auVar33,auVar223,auVar11);
        fVar148 = auVar110._0_4_;
        auVar207._0_4_ = auVar12._0_4_ * fVar148;
        fVar123 = auVar110._4_4_;
        auVar207._4_4_ = auVar12._4_4_ * fVar123;
        fVar125 = auVar110._8_4_;
        auVar207._8_4_ = auVar12._8_4_ * fVar125;
        fVar127 = auVar110._12_4_;
        auVar207._12_4_ = auVar12._12_4_ * fVar127;
        auVar207._16_4_ = auVar12._16_4_ * 0.0;
        auVar207._20_4_ = auVar12._20_4_ * 0.0;
        auVar207._24_4_ = auVar12._24_4_ * 0.0;
        auVar207._28_4_ = 0;
        auVar34._4_4_ = -auVar160._4_4_ * fVar123;
        auVar34._0_4_ = -auVar160._0_4_ * fVar148;
        auVar34._8_4_ = -auVar160._8_4_ * fVar125;
        auVar34._12_4_ = -auVar160._12_4_ * fVar127;
        auVar34._16_4_ = -auVar160._16_4_ * 0.0;
        auVar34._20_4_ = -auVar160._20_4_ * 0.0;
        auVar34._24_4_ = -auVar160._24_4_ * 0.0;
        auVar34._28_4_ = auVar12._28_4_;
        auVar35._28_4_ = auVar11._28_4_;
        auVar35._0_28_ =
             ZEXT1628(CONCAT412(fVar127 * 0.0,
                                CONCAT48(fVar125 * 0.0,CONCAT44(fVar123 * 0.0,fVar148 * 0.0))));
        auVar110 = vfmadd213ps_fma(auVar23,ZEXT1632(auVar18),local_200);
        auVar160 = ZEXT1632(auVar18);
        auVar20 = vfmadd213ps_fma(auVar31,auVar160,auVar112);
        auVar108 = vfmadd213ps_fma(auVar32,auVar160,ZEXT1632(auVar17));
        auVar132 = vfnmadd213ps_fma(auVar23,auVar160,local_200);
        auVar107 = vfmadd213ps_fma(auVar207,ZEXT1632(auVar19),local_1c0);
        auVar106 = vfnmadd213ps_fma(auVar31,auVar160,auVar112);
        auVar160 = ZEXT1632(auVar19);
        auVar150 = vfmadd213ps_fma(auVar34,auVar160,local_1e0);
        local_560 = ZEXT1632(auVar18);
        auVar170 = vfnmadd231ps_fma(ZEXT1632(auVar17),local_560,auVar32);
        auVar17 = vfmadd213ps_fma(auVar35,auVar160,ZEXT1632(auVar21));
        auVar133 = vfnmadd213ps_fma(auVar207,auVar160,local_1c0);
        auVar163 = vfnmadd213ps_fma(auVar34,auVar160,local_1e0);
        _local_4c0 = ZEXT1632(auVar19);
        auVar105 = vfnmadd231ps_fma(ZEXT1632(auVar21),_local_4c0,auVar35);
        auVar160 = vsubps_avx(ZEXT1632(auVar150),ZEXT1632(auVar106));
        auVar11 = vsubps_avx(ZEXT1632(auVar17),ZEXT1632(auVar170));
        auVar112._4_4_ = auVar170._4_4_ * auVar160._4_4_;
        auVar112._0_4_ = auVar170._0_4_ * auVar160._0_4_;
        auVar112._8_4_ = auVar170._8_4_ * auVar160._8_4_;
        auVar112._12_4_ = auVar170._12_4_ * auVar160._12_4_;
        auVar112._16_4_ = auVar160._16_4_ * 0.0;
        auVar112._20_4_ = auVar160._20_4_ * 0.0;
        auVar112._24_4_ = auVar160._24_4_ * 0.0;
        auVar112._28_4_ = 0;
        auVar18 = vfmsub231ps_fma(auVar112,ZEXT1632(auVar106),auVar11);
        auVar36._4_4_ = auVar11._4_4_ * auVar132._4_4_;
        auVar36._0_4_ = auVar11._0_4_ * auVar132._0_4_;
        auVar36._8_4_ = auVar11._8_4_ * auVar132._8_4_;
        auVar36._12_4_ = auVar11._12_4_ * auVar132._12_4_;
        auVar36._16_4_ = auVar11._16_4_ * 0.0;
        auVar36._20_4_ = auVar11._20_4_ * 0.0;
        auVar36._24_4_ = auVar11._24_4_ * 0.0;
        auVar36._28_4_ = auVar11._28_4_;
        auVar11 = vsubps_avx(ZEXT1632(auVar107),ZEXT1632(auVar132));
        auVar21 = vfmsub231ps_fma(auVar36,ZEXT1632(auVar170),auVar11);
        auVar37._4_4_ = auVar106._4_4_ * auVar11._4_4_;
        auVar37._0_4_ = auVar106._0_4_ * auVar11._0_4_;
        auVar37._8_4_ = auVar106._8_4_ * auVar11._8_4_;
        auVar37._12_4_ = auVar106._12_4_ * auVar11._12_4_;
        auVar37._16_4_ = auVar11._16_4_ * 0.0;
        auVar37._20_4_ = auVar11._20_4_ * 0.0;
        auVar37._24_4_ = auVar11._24_4_ * 0.0;
        auVar37._28_4_ = auVar11._28_4_;
        auVar140 = ZEXT1632(auVar132);
        auVar19 = vfmsub231ps_fma(auVar37,auVar140,auVar160);
        auVar21 = vfmadd231ps_fma(ZEXT1632(auVar19),ZEXT832(0) << 0x20,ZEXT1632(auVar21));
        auVar21 = vfmadd231ps_fma(ZEXT1632(auVar21),ZEXT832(0) << 0x20,ZEXT1632(auVar18));
        auVar16 = vcmpps_avx(ZEXT1632(auVar21),ZEXT832(0) << 0x20,2);
        local_7a0 = vblendvps_avx(ZEXT1632(auVar133),ZEXT1632(auVar110),auVar16);
        auVar160 = vblendvps_avx(ZEXT1632(auVar163),ZEXT1632(auVar20),auVar16);
        local_640._0_32_ = vblendvps_avx(ZEXT1632(auVar105),ZEXT1632(auVar108),auVar16);
        auVar11 = vblendvps_avx(auVar140,ZEXT1632(auVar107),auVar16);
        auVar184 = vblendvps_avx(ZEXT1632(auVar106),ZEXT1632(auVar150),auVar16);
        auVar111 = vblendvps_avx(ZEXT1632(auVar170),ZEXT1632(auVar17),auVar16);
        auVar140 = vblendvps_avx(ZEXT1632(auVar107),auVar140,auVar16);
        auVar12 = vblendvps_avx(ZEXT1632(auVar150),ZEXT1632(auVar106),auVar16);
        auVar21 = vpackssdw_avx(local_220._0_16_,local_220._16_16_);
        local_780 = ZEXT1632(auVar21);
        auVar119 = vblendvps_avx(ZEXT1632(auVar17),ZEXT1632(auVar170),auVar16);
        auVar22 = vsubps_avx(auVar140,local_7a0);
        auVar23 = vsubps_avx(auVar12,auVar160);
        auVar113 = vsubps_avx(auVar119,local_640._0_32_);
        auVar26 = vsubps_avx(local_7a0,auVar11);
        auVar24 = vsubps_avx(auVar160,auVar184);
        auVar25 = vsubps_avx(local_640._0_32_,auVar111);
        auVar38._4_4_ = auVar113._4_4_ * local_7a0._4_4_;
        auVar38._0_4_ = auVar113._0_4_ * local_7a0._0_4_;
        auVar38._8_4_ = auVar113._8_4_ * local_7a0._8_4_;
        auVar38._12_4_ = auVar113._12_4_ * local_7a0._12_4_;
        auVar38._16_4_ = auVar113._16_4_ * local_7a0._16_4_;
        auVar38._20_4_ = auVar113._20_4_ * local_7a0._20_4_;
        auVar38._24_4_ = auVar113._24_4_ * local_7a0._24_4_;
        auVar38._28_4_ = auVar119._28_4_;
        auVar17 = vfmsub231ps_fma(auVar38,local_640._0_32_,auVar22);
        auVar39._4_4_ = auVar22._4_4_ * auVar160._4_4_;
        auVar39._0_4_ = auVar22._0_4_ * auVar160._0_4_;
        auVar39._8_4_ = auVar22._8_4_ * auVar160._8_4_;
        auVar39._12_4_ = auVar22._12_4_ * auVar160._12_4_;
        auVar39._16_4_ = auVar22._16_4_ * auVar160._16_4_;
        auVar39._20_4_ = auVar22._20_4_ * auVar160._20_4_;
        auVar39._24_4_ = auVar22._24_4_ * auVar160._24_4_;
        auVar39._28_4_ = auVar140._28_4_;
        auVar110 = vfmsub231ps_fma(auVar39,local_7a0,auVar23);
        auVar17 = vfmadd231ps_fma(ZEXT1632(auVar110),ZEXT832(0) << 0x20,ZEXT1632(auVar17));
        auVar116._0_4_ = auVar23._0_4_ * local_640._0_4_;
        auVar116._4_4_ = auVar23._4_4_ * local_640._4_4_;
        auVar116._8_4_ = auVar23._8_4_ * local_640._8_4_;
        auVar116._12_4_ = auVar23._12_4_ * local_640._12_4_;
        auVar116._16_4_ = auVar23._16_4_ * local_640._16_4_;
        auVar116._20_4_ = auVar23._20_4_ * local_640._20_4_;
        auVar116._24_4_ = auVar23._24_4_ * local_640._24_4_;
        auVar116._28_4_ = 0;
        auVar110 = vfmsub231ps_fma(auVar116,auVar160,auVar113);
        auVar110 = vfmadd231ps_fma(ZEXT1632(auVar17),ZEXT832(0) << 0x20,ZEXT1632(auVar110));
        auVar162 = ZEXT1664(auVar110);
        auVar117._0_4_ = auVar25._0_4_ * auVar11._0_4_;
        auVar117._4_4_ = auVar25._4_4_ * auVar11._4_4_;
        auVar117._8_4_ = auVar25._8_4_ * auVar11._8_4_;
        auVar117._12_4_ = auVar25._12_4_ * auVar11._12_4_;
        auVar117._16_4_ = auVar25._16_4_ * auVar11._16_4_;
        auVar117._20_4_ = auVar25._20_4_ * auVar11._20_4_;
        auVar117._24_4_ = auVar25._24_4_ * auVar11._24_4_;
        auVar117._28_4_ = 0;
        auVar17 = vfmsub231ps_fma(auVar117,auVar26,auVar111);
        auVar40._4_4_ = auVar24._4_4_ * auVar111._4_4_;
        auVar40._0_4_ = auVar24._0_4_ * auVar111._0_4_;
        auVar40._8_4_ = auVar24._8_4_ * auVar111._8_4_;
        auVar40._12_4_ = auVar24._12_4_ * auVar111._12_4_;
        auVar40._16_4_ = auVar24._16_4_ * auVar111._16_4_;
        auVar40._20_4_ = auVar24._20_4_ * auVar111._20_4_;
        auVar40._24_4_ = auVar24._24_4_ * auVar111._24_4_;
        auVar40._28_4_ = auVar111._28_4_;
        auVar18 = vfmsub231ps_fma(auVar40,auVar184,auVar25);
        auVar41._4_4_ = auVar26._4_4_ * auVar184._4_4_;
        auVar41._0_4_ = auVar26._0_4_ * auVar184._0_4_;
        auVar41._8_4_ = auVar26._8_4_ * auVar184._8_4_;
        auVar41._12_4_ = auVar26._12_4_ * auVar184._12_4_;
        auVar41._16_4_ = auVar26._16_4_ * auVar184._16_4_;
        auVar41._20_4_ = auVar26._20_4_ * auVar184._20_4_;
        auVar41._24_4_ = auVar26._24_4_ * auVar184._24_4_;
        auVar41._28_4_ = auVar12._28_4_;
        auVar19 = vfmsub231ps_fma(auVar41,auVar24,auVar11);
        auVar17 = vfmadd231ps_fma(ZEXT1632(auVar19),ZEXT832(0) << 0x20,ZEXT1632(auVar17));
        auVar18 = vfmadd231ps_fma(ZEXT1632(auVar17),ZEXT832(0) << 0x20,ZEXT1632(auVar18));
        auVar11 = vmaxps_avx(ZEXT1632(auVar110),ZEXT1632(auVar18));
        auVar11 = vcmpps_avx(auVar11,ZEXT832(0) << 0x20,2);
        auVar17 = vpackssdw_avx(auVar11._0_16_,auVar11._16_16_);
        auVar21 = vpand_avx(auVar17,auVar21);
        auVar11 = vpmovsxwd_avx2(auVar21);
        if ((((((((auVar11 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar11 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar11 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar11 >> 0x7f,0) == '\0') &&
              (auVar11 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar11 >> 0xbf,0) == '\0') &&
            (auVar11 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar11[0x1f]) {
LAB_016c4ebd:
          auVar190 = ZEXT3264(CONCAT824(local_480[1]._24_8_,
                                        CONCAT816(local_480[1]._16_8_,
                                                  CONCAT88(local_480[1]._8_8_,local_480[1]._0_8_))))
          ;
          auVar209 = ZEXT3264(local_660);
          auVar204 = ZEXT3264(local_6e0);
        }
        else {
          auVar42._4_4_ = auVar23._4_4_ * auVar25._4_4_;
          auVar42._0_4_ = auVar23._0_4_ * auVar25._0_4_;
          auVar42._8_4_ = auVar23._8_4_ * auVar25._8_4_;
          auVar42._12_4_ = auVar23._12_4_ * auVar25._12_4_;
          auVar42._16_4_ = auVar23._16_4_ * auVar25._16_4_;
          auVar42._20_4_ = auVar23._20_4_ * auVar25._20_4_;
          auVar42._24_4_ = auVar23._24_4_ * auVar25._24_4_;
          auVar42._28_4_ = auVar11._28_4_;
          auVar108 = vfmsub231ps_fma(auVar42,auVar24,auVar113);
          auVar138._0_4_ = auVar113._0_4_ * auVar26._0_4_;
          auVar138._4_4_ = auVar113._4_4_ * auVar26._4_4_;
          auVar138._8_4_ = auVar113._8_4_ * auVar26._8_4_;
          auVar138._12_4_ = auVar113._12_4_ * auVar26._12_4_;
          auVar138._16_4_ = auVar113._16_4_ * auVar26._16_4_;
          auVar138._20_4_ = auVar113._20_4_ * auVar26._20_4_;
          auVar138._24_4_ = auVar113._24_4_ * auVar26._24_4_;
          auVar138._28_4_ = 0;
          auVar20 = vfmsub231ps_fma(auVar138,auVar22,auVar25);
          auVar43._4_4_ = auVar22._4_4_ * auVar24._4_4_;
          auVar43._0_4_ = auVar22._0_4_ * auVar24._0_4_;
          auVar43._8_4_ = auVar22._8_4_ * auVar24._8_4_;
          auVar43._12_4_ = auVar22._12_4_ * auVar24._12_4_;
          auVar43._16_4_ = auVar22._16_4_ * auVar24._16_4_;
          auVar43._20_4_ = auVar22._20_4_ * auVar24._20_4_;
          auVar43._24_4_ = auVar22._24_4_ * auVar24._24_4_;
          auVar43._28_4_ = auVar184._28_4_;
          auVar107 = vfmsub231ps_fma(auVar43,auVar26,auVar23);
          auVar17 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar20),ZEXT1632(auVar107));
          auVar19 = vfmadd231ps_fma(ZEXT1632(auVar17),ZEXT1632(auVar108),_DAT_02020f00);
          auVar11 = vrcpps_avx(ZEXT1632(auVar19));
          auVar208._8_4_ = 0x3f800000;
          auVar208._0_8_ = &DAT_3f8000003f800000;
          auVar208._12_4_ = 0x3f800000;
          auVar208._16_4_ = 0x3f800000;
          auVar208._20_4_ = 0x3f800000;
          auVar208._24_4_ = 0x3f800000;
          auVar208._28_4_ = 0x3f800000;
          auVar17 = vfnmadd213ps_fma(auVar11,ZEXT1632(auVar19),auVar208);
          auVar17 = vfmadd132ps_fma(ZEXT1632(auVar17),auVar11,auVar11);
          auVar188._0_4_ = auVar107._0_4_ * local_640._0_4_;
          auVar188._4_4_ = auVar107._4_4_ * local_640._4_4_;
          auVar188._8_4_ = auVar107._8_4_ * local_640._8_4_;
          auVar188._12_4_ = auVar107._12_4_ * local_640._12_4_;
          auVar188._16_4_ = local_640._16_4_ * 0.0;
          auVar188._20_4_ = local_640._20_4_ * 0.0;
          auVar188._24_4_ = local_640._24_4_ * 0.0;
          auVar188._28_4_ = 0;
          auVar20 = vfmadd231ps_fma(auVar188,auVar160,ZEXT1632(auVar20));
          auVar20 = vfmadd231ps_fma(ZEXT1632(auVar20),ZEXT1632(auVar108),local_7a0);
          fVar123 = auVar17._0_4_;
          fVar125 = auVar17._4_4_;
          fVar127 = auVar17._8_4_;
          fVar128 = auVar17._12_4_;
          auVar184 = ZEXT1632(CONCAT412(fVar128 * auVar20._12_4_,
                                        CONCAT48(fVar127 * auVar20._8_4_,
                                                 CONCAT44(fVar125 * auVar20._4_4_,
                                                          fVar123 * auVar20._0_4_))));
          auVar118._4_4_ = uVar7;
          auVar118._0_4_ = uVar7;
          auVar118._8_4_ = uVar7;
          auVar118._12_4_ = uVar7;
          auVar118._16_4_ = uVar7;
          auVar118._20_4_ = uVar7;
          auVar118._24_4_ = uVar7;
          auVar118._28_4_ = uVar7;
          fVar148 = (ray->super_RayK<1>).tfar;
          auVar139._4_4_ = fVar148;
          auVar139._0_4_ = fVar148;
          auVar139._8_4_ = fVar148;
          auVar139._12_4_ = fVar148;
          auVar139._16_4_ = fVar148;
          auVar139._20_4_ = fVar148;
          auVar139._24_4_ = fVar148;
          auVar139._28_4_ = fVar148;
          auVar160 = vcmpps_avx(auVar118,auVar184,2);
          auVar11 = vcmpps_avx(auVar184,auVar139,2);
          auVar160 = vandps_avx(auVar11,auVar160);
          auVar17 = vpackssdw_avx(auVar160._0_16_,auVar160._16_16_);
          auVar21 = vpand_avx(auVar21,auVar17);
          auVar160 = vpmovsxwd_avx2(auVar21);
          if ((((((((auVar160 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar160 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar160 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar160 >> 0x7f,0) == '\0') &&
                (auVar160 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar160 >> 0xbf,0) == '\0') &&
              (auVar160 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar160[0x1f]) goto LAB_016c4ebd;
          auVar160 = vcmpps_avx(ZEXT1632(auVar19),ZEXT832(0) << 0x20,4);
          auVar17 = vpackssdw_avx(auVar160._0_16_,auVar160._16_16_);
          auVar21 = vpand_avx(auVar21,auVar17);
          auVar160 = vpmovsxwd_avx2(auVar21);
          auVar190 = ZEXT3264(CONCAT824(local_480[1]._24_8_,
                                        CONCAT816(local_480[1]._16_8_,
                                                  CONCAT88(local_480[1]._8_8_,local_480[1]._0_8_))))
          ;
          auVar209 = ZEXT3264(local_660);
          auVar204 = ZEXT3264(local_6e0);
          if ((((((((auVar160 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar160 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar160 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar160 >> 0x7f,0) != '\0') ||
                (auVar160 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar160 >> 0xbf,0) != '\0') ||
              (auVar160 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar160[0x1f] < '\0') {
            auVar111 = ZEXT1632(CONCAT412(fVar128 * auVar110._12_4_,
                                          CONCAT48(fVar127 * auVar110._8_4_,
                                                   CONCAT44(fVar125 * auVar110._4_4_,
                                                            fVar123 * auVar110._0_4_))));
            auVar140 = ZEXT1632(CONCAT412(fVar128 * auVar18._12_4_,
                                          CONCAT48(fVar127 * auVar18._8_4_,
                                                   CONCAT44(fVar125 * auVar18._4_4_,
                                                            fVar123 * auVar18._0_4_))));
            auVar176._8_4_ = 0x3f800000;
            auVar176._0_8_ = &DAT_3f8000003f800000;
            auVar176._12_4_ = 0x3f800000;
            auVar176._16_4_ = 0x3f800000;
            auVar176._20_4_ = 0x3f800000;
            auVar176._24_4_ = 0x3f800000;
            auVar176._28_4_ = 0x3f800000;
            auVar11 = vsubps_avx(auVar176,auVar111);
            auVar162 = ZEXT3264(auVar11);
            auVar11 = vblendvps_avx(auVar11,auVar111,auVar16);
            auVar209 = ZEXT3264(auVar11);
            auVar11 = vsubps_avx(auVar176,auVar140);
            local_240 = vblendvps_avx(auVar11,auVar140,auVar16);
            auVar190 = ZEXT3264(auVar160);
            auVar204 = ZEXT3264(auVar184);
          }
        }
        auVar225 = ZEXT3264(local_6a0);
        auVar218 = ZEXT3264(_local_4e0);
        auVar213 = ZEXT3264(local_680);
        auVar160 = auVar190._0_32_;
        if ((((((((auVar160 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar160 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar160 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar160 >> 0x7f,0) == '\0') &&
              (auVar190 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
             SUB321(auVar160 >> 0xbf,0) == '\0') &&
            (auVar190 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
            -1 < auVar190[0x1f]) {
          auVar147 = ZEXT3264(local_520);
          auVar194 = ZEXT3264(CONCAT428(local_500,
                                        CONCAT424(local_500,
                                                  CONCAT420(local_500,
                                                            CONCAT416(local_500,
                                                                      CONCAT412(local_500,
                                                                                CONCAT48(local_500,
                                                                                         CONCAT44(
                                                  local_500,local_500))))))));
          auVar199 = ZEXT3264(local_5e0);
          auVar190 = ZEXT3264(local_5c0);
        }
        else {
          auVar11 = vsubps_avx(_local_4c0,local_560);
          local_3a0 = auVar209._0_32_;
          auVar21 = vfmadd213ps_fma(auVar11,local_3a0,local_560);
          fVar148 = pre->depth_scale;
          auVar44._4_4_ = (auVar21._4_4_ + auVar21._4_4_) * fVar148;
          auVar44._0_4_ = (auVar21._0_4_ + auVar21._0_4_) * fVar148;
          auVar44._8_4_ = (auVar21._8_4_ + auVar21._8_4_) * fVar148;
          auVar44._12_4_ = (auVar21._12_4_ + auVar21._12_4_) * fVar148;
          auVar44._16_4_ = fVar148 * 0.0;
          auVar44._20_4_ = fVar148 * 0.0;
          auVar44._24_4_ = fVar148 * 0.0;
          auVar44._28_4_ = 0;
          local_360 = auVar204._0_32_;
          auVar11 = vcmpps_avx(local_360,auVar44,6);
          auVar184 = auVar160 & auVar11;
          auVar194 = ZEXT3264(CONCAT428(local_500,
                                        CONCAT424(local_500,
                                                  CONCAT420(local_500,
                                                            CONCAT416(local_500,
                                                                      CONCAT412(local_500,
                                                                                CONCAT48(local_500,
                                                                                         CONCAT44(
                                                  local_500,local_500))))))));
          auVar199 = ZEXT3264(local_5e0);
          auVar190 = ZEXT3264(local_5c0);
          if ((((((((auVar184 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar184 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar184 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar184 >> 0x7f,0) != '\0') ||
                (auVar184 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar184 >> 0xbf,0) != '\0') ||
              (auVar184 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar184[0x1f] < '\0') {
            auVar160 = vandps_avx(auVar11,auVar160);
            auVar141._8_4_ = 0xbf800000;
            auVar141._0_8_ = 0xbf800000bf800000;
            auVar141._12_4_ = 0xbf800000;
            auVar141._16_4_ = 0xbf800000;
            auVar141._20_4_ = 0xbf800000;
            auVar141._24_4_ = 0xbf800000;
            auVar141._28_4_ = 0xbf800000;
            auVar158._8_4_ = 0x40000000;
            auVar158._0_8_ = 0x4000000040000000;
            auVar158._12_4_ = 0x40000000;
            auVar158._16_4_ = 0x40000000;
            auVar158._20_4_ = 0x40000000;
            auVar158._24_4_ = 0x40000000;
            auVar158._28_4_ = 0x40000000;
            auVar162 = ZEXT3264(auVar158);
            auVar21 = vfmadd213ps_fma(local_240,auVar158,auVar141);
            local_240 = ZEXT1632(auVar21);
            auVar11 = local_240;
            local_380 = ZEXT1632(auVar21);
            local_340 = 0;
            local_33c = iVar14;
            local_330 = *(undefined8 *)*pauVar1;
            uStack_328 = *(undefined8 *)(*pauVar1 + 8);
            local_320 = *(undefined8 *)*pauVar2;
            uStack_318 = *(undefined8 *)(*pauVar2 + 8);
            local_310 = *(undefined8 *)*pauVar3;
            uStack_308 = *(undefined8 *)(*pauVar3 + 8);
            local_2e0 = auVar160;
            local_240 = auVar11;
            if ((pGVar101->mask & (ray->super_RayK<1>).mask) != 0) {
              local_480[0] = auVar160;
              fVar148 = 1.0 / auVar114._0_4_;
              local_2c0[0] = fVar148 * (auVar209._0_4_ + 0.0);
              local_2c0[1] = fVar148 * (auVar209._4_4_ + 1.0);
              local_2c0[2] = fVar148 * (auVar209._8_4_ + 2.0);
              local_2c0[3] = fVar148 * (auVar209._12_4_ + 3.0);
              fStack_2b0 = fVar148 * (auVar209._16_4_ + 4.0);
              fStack_2ac = fVar148 * (auVar209._20_4_ + 5.0);
              fStack_2a8 = fVar148 * (auVar209._24_4_ + 6.0);
              fStack_2a4 = auVar209._28_4_ + 7.0;
              local_240._0_8_ = auVar21._0_8_;
              local_240._8_8_ = auVar21._8_8_;
              local_2a0 = local_240._0_8_;
              uStack_298 = local_240._8_8_;
              uStack_290 = 0;
              uStack_288 = 0;
              local_280 = local_360;
              auVar142._8_4_ = 0x7f800000;
              auVar142._0_8_ = 0x7f8000007f800000;
              auVar142._12_4_ = 0x7f800000;
              auVar142._16_4_ = 0x7f800000;
              auVar142._20_4_ = 0x7f800000;
              auVar142._24_4_ = 0x7f800000;
              auVar142._28_4_ = 0x7f800000;
              auVar11 = vblendvps_avx(auVar142,local_360,auVar160);
              auVar184 = vshufps_avx(auVar11,auVar11,0xb1);
              auVar184 = vminps_avx(auVar11,auVar184);
              auVar111 = vshufpd_avx(auVar184,auVar184,5);
              auVar184 = vminps_avx(auVar184,auVar111);
              auVar111 = vpermpd_avx2(auVar184,0x4e);
              auVar184 = vminps_avx(auVar184,auVar111);
              auVar11 = vcmpps_avx(auVar11,auVar184,0);
              auVar184 = auVar160 & auVar11;
              if ((((((((auVar184 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar184 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar184 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar184 >> 0x7f,0) != '\0') ||
                    (auVar184 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar184 >> 0xbf,0) != '\0') ||
                  (auVar184 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar184[0x1f] < '\0') {
                auVar160 = vandps_avx(auVar11,auVar160);
              }
              uVar96 = vmovmskps_avx(auVar160);
              uVar7 = 0;
              for (; (uVar96 & 1) == 0; uVar96 = uVar96 >> 1 | 0x80000000) {
                uVar7 = uVar7 + 1;
              }
              uVar98 = (ulong)uVar7;
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar101->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                fVar148 = local_2c0[uVar98];
                fVar123 = 1.0 - fVar148;
                auVar110 = ZEXT416((uint)fVar148);
                auVar21 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar110,
                                          ZEXT416(0xc0a00000));
                auVar17 = vfmadd231ss_fma(ZEXT416((uint)(fVar148 * fVar148 * 3.0)),
                                          ZEXT416((uint)(fVar148 + fVar148)),auVar21);
                auVar21 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar110,
                                          ZEXT416(0x40000000));
                auVar21 = vfmadd231ss_fma(ZEXT416((uint)(fVar123 * fVar123 * -3.0)),
                                          ZEXT416((uint)(fVar123 + fVar123)),auVar21);
                auVar18 = vfnmadd231ss_fma(ZEXT416((uint)(fVar148 * (fVar123 + fVar123))),
                                           ZEXT416((uint)fVar123),ZEXT416((uint)fVar123));
                auVar110 = vfmadd231ss_fma(ZEXT416((uint)(fVar148 * fVar148)),auVar110,
                                           ZEXT416((uint)(fVar123 * -2.0)));
                fVar123 = auVar21._0_4_ * 0.5;
                fVar125 = auVar110._0_4_ * 0.5;
                auVar164._0_4_ = fVar125 * local_610;
                auVar164._4_4_ = fVar125 * fStack_60c;
                auVar164._8_4_ = fVar125 * fStack_608;
                auVar164._12_4_ = fVar125 * fStack_604;
                auVar134._4_4_ = fVar123;
                auVar134._0_4_ = fVar123;
                auVar134._8_4_ = fVar123;
                auVar134._12_4_ = fVar123;
                auVar21 = vfmadd132ps_fma(auVar134,auVar164,*pauVar3);
                fVar123 = auVar17._0_4_ * 0.5;
                auVar165._4_4_ = fVar123;
                auVar165._0_4_ = fVar123;
                auVar165._8_4_ = fVar123;
                auVar165._12_4_ = fVar123;
                auVar21 = vfmadd132ps_fma(auVar165,auVar21,*pauVar2);
                fVar123 = *(float *)((long)&local_2a0 + uVar98 * 4);
                fVar125 = auVar18._0_4_ * 0.5;
                auVar190 = ZEXT3264(local_5c0);
                auVar151._4_4_ = fVar125;
                auVar151._0_4_ = fVar125;
                auVar151._8_4_ = fVar125;
                auVar151._12_4_ = fVar125;
                auVar21 = vfmadd132ps_fma(auVar151,auVar21,*pauVar1);
                auVar162 = ZEXT1664(auVar21);
                (ray->super_RayK<1>).tfar = *(float *)(local_280 + uVar98 * 4);
                uVar104 = vmovlps_avx(auVar21);
                *(undefined8 *)&(ray->Ng).field_0 = uVar104;
                fVar125 = (float)vextractps_avx(auVar21,2);
                (ray->Ng).field_0.field_0.z = fVar125;
                ray->u = fVar148;
                ray->v = fVar123;
                ray->primID = uVar97;
                ray->geomID = uVar95;
                ray->instID[0] = context->user->instID[0];
                ray->instPrimID[0] = context->user->instPrimID[0];
              }
              else {
                local_640._0_16_ = *pauVar2;
                local_560 = ZEXT1632(*pauVar3);
                _local_4c0 = ZEXT1632(*pauVar4);
                local_660 = local_3a0;
                local_6e0 = local_360;
                local_7b0 = prim;
                local_7b8 = context;
                local_7c0 = pre;
                do {
                  local_584 = local_2c0[uVar98];
                  local_580 = *(undefined4 *)((long)&local_2a0 + uVar98 * 4);
                  local_7a0._0_4_ = (ray->super_RayK<1>).tfar;
                  (ray->super_RayK<1>).tfar = *(float *)(local_280 + uVar98 * 4);
                  fVar148 = 1.0 - local_584;
                  auVar110 = ZEXT416((uint)local_584);
                  auVar21 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar110,
                                            ZEXT416(0xc0a00000));
                  auVar17 = vfmadd231ss_fma(ZEXT416((uint)(local_584 * local_584 * 3.0)),
                                            ZEXT416((uint)(local_584 + local_584)),auVar21);
                  auVar21 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar110,
                                            ZEXT416(0x40000000));
                  auVar21 = vfmadd231ss_fma(ZEXT416((uint)(fVar148 * fVar148 * -3.0)),
                                            ZEXT416((uint)(fVar148 + fVar148)),auVar21);
                  auVar18 = vfnmadd231ss_fma(ZEXT416((uint)(local_584 * (fVar148 + fVar148))),
                                             ZEXT416((uint)fVar148),ZEXT416((uint)fVar148));
                  auVar110 = vfmadd231ss_fma(ZEXT416((uint)(local_584 * local_584)),auVar110,
                                             ZEXT416((uint)(fVar148 * -2.0)));
                  fVar148 = auVar21._0_4_ * 0.5;
                  fVar123 = auVar110._0_4_ * 0.5;
                  auVar174._0_4_ = fVar123 * (float)local_4c0._0_4_;
                  auVar174._4_4_ = fVar123 * (float)local_4c0._4_4_;
                  auVar174._8_4_ = fVar123 * fStack_4b8;
                  auVar174._12_4_ = fVar123 * fStack_4b4;
                  auVar155._4_4_ = fVar148;
                  auVar155._0_4_ = fVar148;
                  auVar155._8_4_ = fVar148;
                  auVar155._12_4_ = fVar148;
                  auVar21 = vfmadd132ps_fma(auVar155,auVar174,local_560._0_16_);
                  fVar148 = auVar17._0_4_ * 0.5;
                  auVar175._4_4_ = fVar148;
                  auVar175._0_4_ = fVar148;
                  auVar175._8_4_ = fVar148;
                  auVar175._12_4_ = fVar148;
                  auVar21 = vfmadd132ps_fma(auVar175,auVar21,local_640._0_16_);
                  fVar148 = auVar18._0_4_ * 0.5;
                  auVar156._4_4_ = fVar148;
                  auVar156._0_4_ = fVar148;
                  auVar156._8_4_ = fVar148;
                  auVar156._12_4_ = fVar148;
                  auVar87._8_8_ = uStack_718;
                  auVar87._0_8_ = local_720;
                  auVar21 = vfmadd132ps_fma(auVar156,auVar21,auVar87);
                  local_710.context = context->user;
                  local_590 = vmovlps_avx(auVar21);
                  local_588 = vextractps_avx(auVar21,2);
                  local_57c = (int)local_748;
                  local_578 = (int)local_7a8;
                  local_574 = (local_710.context)->instID[0];
                  local_570 = (local_710.context)->instPrimID[0];
                  local_7c4 = -1;
                  local_710.valid = &local_7c4;
                  local_710.geometryUserPtr = pGVar101->userPtr;
                  local_710.ray = (RTCRayN *)ray;
                  local_710.hit = (RTCHitN *)&local_590;
                  local_710.N = 1;
                  local_780._0_8_ = uVar98;
                  if (pGVar101->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_016c5190:
                    p_Var15 = context->args->filter;
                    if (p_Var15 != (RTCFilterFunctionN)0x0) {
                      if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                         (((pGVar101->field_8).field_0x2 & 0x40) != 0)) {
                        (*p_Var15)(&local_710);
                        auVar218 = ZEXT3264(_local_4e0);
                        auVar199 = ZEXT3264(local_5e0);
                        auVar225 = ZEXT3264(local_6a0);
                        auVar213 = ZEXT3264(local_680);
                        auVar204 = ZEXT3264(local_6e0);
                        auVar209 = ZEXT3264(local_660);
                        uVar98 = local_780._0_8_;
                        prim = local_7b0;
                        context = local_7b8;
                        pre = local_7c0;
                        fVar149 = (float)local_740._0_4_;
                        fVar231 = (float)local_6c0;
                        fVar232 = local_6c0._4_4_;
                        fVar122 = (float)uStack_6b8;
                        fVar124 = uStack_6b8._4_4_;
                        fVar126 = (float)uStack_6b0;
                        fVar233 = uStack_6b0._4_4_;
                        fVar234 = (float)uStack_6a8;
                      }
                      if (*local_710.valid == 0) goto LAB_016c528b;
                    }
                    (((Vec3f *)((long)local_710.ray + 0x30))->field_0).components[0] =
                         *(float *)local_710.hit;
                    (((Vec3f *)((long)local_710.ray + 0x30))->field_0).field_0.y =
                         *(float *)(local_710.hit + 4);
                    (((Vec3f *)((long)local_710.ray + 0x30))->field_0).field_0.z =
                         *(float *)(local_710.hit + 8);
                    *(float *)((long)local_710.ray + 0x3c) = *(float *)(local_710.hit + 0xc);
                    *(float *)((long)local_710.ray + 0x40) = *(float *)(local_710.hit + 0x10);
                    *(float *)((long)local_710.ray + 0x44) = *(float *)(local_710.hit + 0x14);
                    *(float *)((long)local_710.ray + 0x48) = *(float *)(local_710.hit + 0x18);
                    *(float *)((long)local_710.ray + 0x4c) = *(float *)(local_710.hit + 0x1c);
                    *(float *)((long)local_710.ray + 0x50) = *(float *)(local_710.hit + 0x20);
                  }
                  else {
                    (*pGVar101->intersectionFilterN)(&local_710);
                    auVar218 = ZEXT3264(_local_4e0);
                    auVar199 = ZEXT3264(local_5e0);
                    auVar225 = ZEXT3264(local_6a0);
                    auVar213 = ZEXT3264(local_680);
                    auVar204 = ZEXT3264(local_6e0);
                    auVar209 = ZEXT3264(local_660);
                    uVar98 = local_780._0_8_;
                    prim = local_7b0;
                    context = local_7b8;
                    pre = local_7c0;
                    fVar149 = (float)local_740._0_4_;
                    fVar231 = (float)local_6c0;
                    fVar232 = local_6c0._4_4_;
                    fVar122 = (float)uStack_6b8;
                    fVar124 = uStack_6b8._4_4_;
                    fVar126 = (float)uStack_6b0;
                    fVar233 = uStack_6b0._4_4_;
                    fVar234 = (float)uStack_6a8;
                    if (*local_710.valid != 0) goto LAB_016c5190;
LAB_016c528b:
                    (ray->super_RayK<1>).tfar = (float)local_7a0._0_4_;
                  }
                  *(undefined4 *)(local_480[0] + uVar98 * 4) = 0;
                  auVar184 = local_480[0];
                  fVar148 = (ray->super_RayK<1>).tfar;
                  auVar121._4_4_ = fVar148;
                  auVar121._0_4_ = fVar148;
                  auVar121._8_4_ = fVar148;
                  auVar121._12_4_ = fVar148;
                  auVar121._16_4_ = fVar148;
                  auVar121._20_4_ = fVar148;
                  auVar121._24_4_ = fVar148;
                  auVar121._28_4_ = fVar148;
                  auVar11 = vcmpps_avx(auVar204._0_32_,auVar121,2);
                  auVar160 = vandps_avx(auVar11,local_480[0]);
                  local_480[0] = auVar160;
                  auVar11 = auVar184 & auVar11;
                  bVar81 = (auVar11 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
                  bVar82 = (auVar11 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
                  bVar80 = (auVar11 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
                  bVar79 = SUB321(auVar11 >> 0x7f,0) != '\0';
                  bVar78 = (auVar11 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0;
                  bVar77 = SUB321(auVar11 >> 0xbf,0) != '\0';
                  bVar76 = (auVar11 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0;
                  bVar75 = auVar11[0x1f] < '\0';
                  auVar194 = ZEXT3264(CONCAT428(fStack_4e4,
                                                CONCAT424(fStack_4e8,
                                                          CONCAT420(fStack_4ec,
                                                                    CONCAT416(fStack_4f0,
                                                                              CONCAT412(fStack_4f4,
                                                                                        CONCAT48(
                                                  fStack_4f8,CONCAT44(fStack_4fc,local_500))))))));
                  auVar190 = ZEXT3264(local_5c0);
                  if (((((((bVar81 || bVar82) || bVar80) || bVar79) || bVar78) || bVar77) || bVar76)
                      || bVar75) {
                    auVar146._8_4_ = 0x7f800000;
                    auVar146._0_8_ = 0x7f8000007f800000;
                    auVar146._12_4_ = 0x7f800000;
                    auVar146._16_4_ = 0x7f800000;
                    auVar146._20_4_ = 0x7f800000;
                    auVar146._24_4_ = 0x7f800000;
                    auVar146._28_4_ = 0x7f800000;
                    auVar11 = vblendvps_avx(auVar146,auVar204._0_32_,auVar160);
                    auVar184 = vshufps_avx(auVar11,auVar11,0xb1);
                    auVar184 = vminps_avx(auVar11,auVar184);
                    auVar111 = vshufpd_avx(auVar184,auVar184,5);
                    auVar184 = vminps_avx(auVar184,auVar111);
                    auVar111 = vpermpd_avx2(auVar184,0x4e);
                    auVar184 = vminps_avx(auVar184,auVar111);
                    auVar11 = vcmpps_avx(auVar11,auVar184,0);
                    auVar111 = auVar160 & auVar11;
                    if ((((((((auVar111 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar111 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar111 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar111 >> 0x7f,0) != '\0') ||
                          (auVar111 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar111 >> 0xbf,0) != '\0') ||
                        (auVar111 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar111[0x1f] < '\0') {
                      auVar160 = vandps_avx(auVar11,auVar160);
                    }
                    uVar97 = vmovmskps_avx(auVar160);
                    uVar95 = 0;
                    for (; (uVar97 & 1) == 0; uVar97 = uVar97 >> 1 | 0x80000000) {
                      uVar95 = uVar95 + 1;
                    }
                    uVar98 = (ulong)uVar95;
                  }
                  auVar162 = ZEXT3264(auVar184);
                } while (((((((bVar81 || bVar82) || bVar80) || bVar79) || bVar78) || bVar77) ||
                         bVar76) || bVar75);
              }
            }
          }
          auVar147 = ZEXT3264(local_520);
        }
      }
      if (8 < iVar14) {
        _local_4e0 = auVar218._0_32_;
        local_220._4_4_ = iVar14;
        local_220._0_4_ = iVar14;
        local_220._8_4_ = iVar14;
        local_220._12_4_ = iVar14;
        local_220._16_4_ = iVar14;
        local_220._20_4_ = iVar14;
        local_220._24_4_ = iVar14;
        local_220._28_4_ = iVar14;
        local_120 = fVar149;
        fStack_11c = fVar149;
        fStack_118 = fVar149;
        fStack_114 = fVar149;
        fStack_110 = fVar149;
        fStack_10c = fVar149;
        fStack_108 = fVar149;
        fStack_104 = fVar149;
        local_140 = local_540._0_4_;
        uStack_13c = local_540._0_4_;
        uStack_138 = local_540._0_4_;
        uStack_134 = local_540._0_4_;
        uStack_130 = local_540._0_4_;
        uStack_12c = local_540._0_4_;
        uStack_128 = local_540._0_4_;
        uStack_124 = local_540._0_4_;
        local_160 = 1.0 / (float)local_3c0._0_4_;
        fStack_15c = local_160;
        fStack_158 = local_160;
        fStack_154 = local_160;
        fStack_150 = local_160;
        fStack_14c = local_160;
        fStack_148 = local_160;
        fStack_144 = local_160;
        lVar99 = 8;
        local_660 = auVar209._0_32_;
        local_6e0 = auVar204._0_32_;
        do {
          auVar160 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar99 * 4 + lVar27);
          auVar11 = *(undefined1 (*) [32])(lVar27 + 0x22307f0 + lVar99 * 4);
          auVar184 = *(undefined1 (*) [32])(lVar27 + 0x2230c74 + lVar99 * 4);
          pauVar5 = (undefined1 (*) [32])(lVar27 + 0x22310f8 + lVar99 * 4);
          auVar94 = *(undefined1 (*) [28])*pauVar5;
          auVar219._0_4_ = auVar194._0_4_ * *(float *)*pauVar5;
          auVar219._4_4_ = auVar194._4_4_ * *(float *)(*pauVar5 + 4);
          auVar219._8_4_ = auVar194._8_4_ * *(float *)(*pauVar5 + 8);
          auVar219._12_4_ = auVar194._12_4_ * *(float *)(*pauVar5 + 0xc);
          auVar219._16_4_ = auVar194._16_4_ * *(float *)(*pauVar5 + 0x10);
          auVar219._20_4_ = auVar194._20_4_ * *(float *)(*pauVar5 + 0x14);
          auVar219._28_36_ = auVar218._28_36_;
          auVar219._24_4_ = auVar194._24_4_ * *(float *)(*pauVar5 + 0x18);
          auVar218._0_4_ = fVar231 * *(float *)*pauVar5;
          auVar218._4_4_ = fVar232 * *(float *)(*pauVar5 + 4);
          auVar218._8_4_ = fVar122 * *(float *)(*pauVar5 + 8);
          auVar218._12_4_ = fVar124 * *(float *)(*pauVar5 + 0xc);
          auVar218._16_4_ = fVar126 * *(float *)(*pauVar5 + 0x10);
          auVar218._20_4_ = fVar233 * *(float *)(*pauVar5 + 0x14);
          auVar218._28_36_ = auVar162._28_36_;
          auVar218._24_4_ = fVar234 * *(float *)(*pauVar5 + 0x18);
          auVar21 = vfmadd231ps_fma(auVar219._0_32_,auVar184,auVar213._0_32_);
          auVar17 = vfmadd231ps_fma(auVar218._0_32_,auVar184,auVar225._0_32_);
          auVar21 = vfmadd231ps_fma(ZEXT1632(auVar21),auVar11,auVar199._0_32_);
          auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar11,auVar147._0_32_);
          auVar21 = vfmadd231ps_fma(ZEXT1632(auVar21),auVar160,auVar190._0_32_);
          auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar160,local_4a0);
          auVar111 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar99 * 4 + lVar27);
          auVar140 = *(undefined1 (*) [32])(lVar27 + 0x2232c10 + lVar99 * 4);
          auVar12 = *(undefined1 (*) [32])(lVar27 + 0x2233094 + lVar99 * 4);
          pfVar6 = (float *)(lVar27 + 0x2233518 + lVar99 * 4);
          fVar123 = *pfVar6;
          fVar125 = pfVar6[1];
          fVar127 = pfVar6[2];
          fVar128 = pfVar6[3];
          fVar129 = pfVar6[4];
          fVar130 = pfVar6[5];
          fVar83 = pfVar6[6];
          auVar45._4_4_ = auVar194._4_4_ * fVar125;
          auVar45._0_4_ = auVar194._0_4_ * fVar123;
          auVar45._8_4_ = auVar194._8_4_ * fVar127;
          auVar45._12_4_ = auVar194._12_4_ * fVar128;
          auVar45._16_4_ = auVar194._16_4_ * fVar129;
          auVar45._20_4_ = auVar194._20_4_ * fVar130;
          auVar45._24_4_ = auVar194._24_4_ * fVar83;
          auVar45._28_4_ = local_4a0._28_4_;
          auVar162._0_4_ = fVar231 * fVar123;
          auVar162._4_4_ = fVar232 * fVar125;
          auVar162._8_4_ = fVar122 * fVar127;
          auVar162._12_4_ = fVar124 * fVar128;
          auVar162._16_4_ = fVar126 * fVar129;
          auVar162._20_4_ = fVar233 * fVar130;
          auVar162._28_36_ = auVar194._28_36_;
          auVar162._24_4_ = fVar234 * fVar83;
          auVar110 = vfmadd231ps_fma(auVar45,auVar12,auVar213._0_32_);
          auVar18 = vfmadd231ps_fma(auVar162._0_32_,auVar12,auVar225._0_32_);
          auVar110 = vfmadd231ps_fma(ZEXT1632(auVar110),auVar140,auVar199._0_32_);
          auVar18 = vfmadd231ps_fma(ZEXT1632(auVar18),auVar140,auVar147._0_32_);
          auVar110 = vfmadd231ps_fma(ZEXT1632(auVar110),auVar111,auVar190._0_32_);
          auVar18 = vfmadd231ps_fma(ZEXT1632(auVar18),auVar111,local_4a0);
          local_1e0 = ZEXT1632(auVar110);
          local_200 = ZEXT1632(auVar21);
          _local_4c0 = vsubps_avx(local_1e0,local_200);
          local_1c0 = ZEXT1632(auVar18);
          local_560 = ZEXT1632(auVar17);
          _local_440 = vsubps_avx(local_1c0,local_560);
          auVar46._4_4_ = auVar17._4_4_ * local_4c0._4_4_;
          auVar46._0_4_ = auVar17._0_4_ * local_4c0._0_4_;
          auVar46._8_4_ = auVar17._8_4_ * local_4c0._8_4_;
          auVar46._12_4_ = auVar17._12_4_ * local_4c0._12_4_;
          auVar46._16_4_ = local_4c0._16_4_ * 0.0;
          auVar46._20_4_ = local_4c0._20_4_ * 0.0;
          auVar46._24_4_ = local_4c0._24_4_ * 0.0;
          auVar46._28_4_ = auVar111._28_4_;
          fVar149 = local_440._0_4_;
          auVar204._0_4_ = auVar21._0_4_ * fVar149;
          fVar122 = local_440._4_4_;
          auVar204._4_4_ = auVar21._4_4_ * fVar122;
          fVar124 = local_440._8_4_;
          auVar204._8_4_ = auVar21._8_4_ * fVar124;
          fVar126 = local_440._12_4_;
          auVar204._12_4_ = auVar21._12_4_ * fVar126;
          fVar233 = local_440._16_4_;
          auVar204._16_4_ = fVar233 * 0.0;
          fVar234 = local_440._20_4_;
          auVar204._20_4_ = fVar234 * 0.0;
          fVar148 = local_440._24_4_;
          auVar204._28_36_ = auVar147._28_36_;
          auVar204._24_4_ = fVar148 * 0.0;
          auVar218 = ZEXT3264(auVar184);
          auVar16 = vsubps_avx(auVar46,auVar204._0_32_);
          local_740._0_4_ = auVar94._0_4_;
          local_740._4_4_ = auVar94._4_4_;
          fStack_738 = auVar94._8_4_;
          fStack_734 = auVar94._12_4_;
          fStack_730 = auVar94._16_4_;
          fStack_72c = auVar94._20_4_;
          fStack_728 = auVar94._24_4_;
          auVar159._0_4_ = (float)local_e0 * (float)local_740._0_4_;
          auVar159._4_4_ = local_e0._4_4_ * (float)local_740._4_4_;
          auVar159._8_4_ = (float)uStack_d8 * fStack_738;
          auVar159._12_4_ = uStack_d8._4_4_ * fStack_734;
          auVar159._16_4_ = (float)uStack_d0 * fStack_730;
          auVar159._20_4_ = uStack_d0._4_4_ * fStack_72c;
          auVar159._24_4_ = (float)uStack_c8 * fStack_728;
          auVar159._28_4_ = 0;
          auVar21 = vfmadd231ps_fma(auVar159,auVar184,local_c0);
          auVar21 = vfmadd231ps_fma(ZEXT1632(auVar21),auVar11,local_a0);
          auVar21 = vfmadd231ps_fma(ZEXT1632(auVar21),local_80,auVar160);
          auVar162 = ZEXT1664(auVar21);
          auVar47._4_4_ = local_e0._4_4_ * fVar125;
          auVar47._0_4_ = (float)local_e0 * fVar123;
          auVar47._8_4_ = (float)uStack_d8 * fVar127;
          auVar47._12_4_ = uStack_d8._4_4_ * fVar128;
          auVar47._16_4_ = (float)uStack_d0 * fVar129;
          auVar47._20_4_ = uStack_d0._4_4_ * fVar130;
          auVar47._24_4_ = (float)uStack_c8 * fVar83;
          auVar47._28_4_ = uStack_c8._4_4_;
          auVar110 = vfmadd231ps_fma(auVar47,auVar12,local_c0);
          auVar110 = vfmadd231ps_fma(ZEXT1632(auVar110),auVar140,local_a0);
          auVar110 = vfmadd231ps_fma(ZEXT1632(auVar110),auVar111,local_80);
          auVar48._4_4_ = fVar122 * fVar122;
          auVar48._0_4_ = fVar149 * fVar149;
          auVar48._8_4_ = fVar124 * fVar124;
          auVar48._12_4_ = fVar126 * fVar126;
          auVar48._16_4_ = fVar233 * fVar233;
          auVar48._20_4_ = fVar234 * fVar234;
          auVar48._24_4_ = fVar148 * fVar148;
          auVar48._28_4_ = local_80._28_4_;
          auVar18 = vfmadd231ps_fma(auVar48,_local_4c0,_local_4c0);
          local_640._0_32_ = ZEXT1632(auVar110);
          auVar119 = vmaxps_avx(ZEXT1632(auVar21),local_640._0_32_);
          auVar201._0_4_ = auVar119._0_4_ * auVar119._0_4_ * auVar18._0_4_;
          auVar201._4_4_ = auVar119._4_4_ * auVar119._4_4_ * auVar18._4_4_;
          auVar201._8_4_ = auVar119._8_4_ * auVar119._8_4_ * auVar18._8_4_;
          auVar201._12_4_ = auVar119._12_4_ * auVar119._12_4_ * auVar18._12_4_;
          auVar201._16_4_ = auVar119._16_4_ * auVar119._16_4_ * 0.0;
          auVar201._20_4_ = auVar119._20_4_ * auVar119._20_4_ * 0.0;
          auVar201._24_4_ = auVar119._24_4_ * auVar119._24_4_ * 0.0;
          auVar201._28_4_ = 0;
          auVar49._4_4_ = auVar16._4_4_ * auVar16._4_4_;
          auVar49._0_4_ = auVar16._0_4_ * auVar16._0_4_;
          auVar49._8_4_ = auVar16._8_4_ * auVar16._8_4_;
          auVar49._12_4_ = auVar16._12_4_ * auVar16._12_4_;
          auVar49._16_4_ = auVar16._16_4_ * auVar16._16_4_;
          auVar49._20_4_ = auVar16._20_4_ * auVar16._20_4_;
          auVar49._24_4_ = auVar16._24_4_ * auVar16._24_4_;
          auVar49._28_4_ = pfVar6[7];
          auVar119 = vcmpps_avx(auVar49,auVar201,2);
          local_340 = (int)lVar99;
          auVar202._4_4_ = local_340;
          auVar202._0_4_ = local_340;
          auVar202._8_4_ = local_340;
          auVar202._12_4_ = local_340;
          auVar202._16_4_ = local_340;
          auVar202._20_4_ = local_340;
          auVar202._24_4_ = local_340;
          auVar202._28_4_ = local_340;
          auVar16 = vpor_avx2(auVar202,_DAT_0205a920);
          auVar22 = vpcmpgtd_avx2(local_220,auVar16);
          auVar16 = auVar22 & auVar119;
          auVar23 = *pauVar5;
          fVar231 = (float)local_6c0;
          fVar232 = local_6c0._4_4_;
          fVar122 = (float)uStack_6b8;
          fVar124 = uStack_6b8._4_4_;
          fVar126 = (float)uStack_6b0;
          fVar233 = uStack_6b0._4_4_;
          fVar234 = (float)uStack_6a8;
          if ((((((((auVar16 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar16 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar16 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar16 >> 0x7f,0) == '\0') &&
                (auVar16 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar16 >> 0xbf,0) == '\0') &&
              (auVar16 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar16[0x1f]) {
LAB_016c4741:
            _local_740 = auVar23;
            auVar225 = ZEXT3264(local_6a0);
            auVar213 = ZEXT3264(local_680);
            auVar204 = ZEXT3264(local_6e0);
            auVar194 = ZEXT3264(CONCAT428(fStack_4e4,
                                          CONCAT424(fStack_4e8,
                                                    CONCAT420(fStack_4ec,
                                                              CONCAT416(fStack_4f0,
                                                                        CONCAT412(fStack_4f4,
                                                                                  CONCAT48(
                                                  fStack_4f8,CONCAT44(fStack_4fc,local_500))))))));
            auVar199 = ZEXT3264(local_5e0);
            auVar190 = ZEXT3264(local_5c0);
          }
          else {
            local_3c0 = vandps_avx(auVar22,auVar119);
            auVar50._4_4_ = (float)local_4e0._4_4_ * fVar125;
            auVar50._0_4_ = (float)local_4e0._0_4_ * fVar123;
            auVar50._8_4_ = fStack_4d8 * fVar127;
            auVar50._12_4_ = fStack_4d4 * fVar128;
            auVar50._16_4_ = fStack_4d0 * fVar129;
            auVar50._20_4_ = fStack_4cc * fVar130;
            auVar50._24_4_ = fStack_4c8 * fVar83;
            auVar50._28_4_ = auVar119._28_4_;
            auVar110 = vfmadd213ps_fma(auVar12,local_180,auVar50);
            auVar110 = vfmadd213ps_fma(auVar140,local_400,ZEXT1632(auVar110));
            auVar110 = vfmadd132ps_fma(auVar111,ZEXT1632(auVar110),local_420);
            auVar51._4_4_ = (float)local_4e0._4_4_ * (float)local_740._4_4_;
            auVar51._0_4_ = (float)local_4e0._0_4_ * (float)local_740._0_4_;
            auVar51._8_4_ = fStack_4d8 * fStack_738;
            auVar51._12_4_ = fStack_4d4 * fStack_734;
            auVar51._16_4_ = fStack_4d0 * fStack_730;
            auVar51._20_4_ = fStack_4cc * fStack_72c;
            auVar51._24_4_ = fStack_4c8 * fStack_728;
            auVar51._28_4_ = auVar119._28_4_;
            auVar18 = vfmadd213ps_fma(auVar184,local_180,auVar51);
            auVar18 = vfmadd213ps_fma(auVar11,local_400,ZEXT1632(auVar18));
            auVar11 = *(undefined1 (*) [32])(lVar27 + 0x223157c + lVar99 * 4);
            auVar184 = *(undefined1 (*) [32])(lVar27 + 0x2231a00 + lVar99 * 4);
            auVar111 = *(undefined1 (*) [32])(lVar27 + 0x2231e84 + lVar99 * 4);
            pfVar6 = (float *)(lVar27 + 0x2232308 + lVar99 * 4);
            fVar149 = *pfVar6;
            fVar148 = pfVar6[1];
            fVar123 = pfVar6[2];
            fVar125 = pfVar6[3];
            fVar127 = pfVar6[4];
            fVar128 = pfVar6[5];
            fVar129 = pfVar6[6];
            auVar197._0_4_ = local_500 * fVar149;
            auVar197._4_4_ = fStack_4fc * fVar148;
            auVar197._8_4_ = fStack_4f8 * fVar123;
            auVar197._12_4_ = fStack_4f4 * fVar125;
            auVar197._16_4_ = fStack_4f0 * fVar127;
            auVar197._20_4_ = fStack_4ec * fVar128;
            auVar197._24_4_ = fStack_4e8 * fVar129;
            auVar197._28_4_ = 0;
            auVar216._0_4_ = (float)local_6c0 * fVar149;
            auVar216._4_4_ = local_6c0._4_4_ * fVar148;
            auVar216._8_4_ = (float)uStack_6b8 * fVar123;
            auVar216._12_4_ = uStack_6b8._4_4_ * fVar125;
            auVar216._16_4_ = (float)uStack_6b0 * fVar127;
            auVar216._20_4_ = uStack_6b0._4_4_ * fVar128;
            auVar216._24_4_ = (float)uStack_6a8 * fVar129;
            auVar216._28_4_ = 0;
            auVar52._4_4_ = fVar148 * (float)local_4e0._4_4_;
            auVar52._0_4_ = fVar149 * (float)local_4e0._0_4_;
            auVar52._8_4_ = fVar123 * fStack_4d8;
            auVar52._12_4_ = fVar125 * fStack_4d4;
            auVar52._16_4_ = fVar127 * fStack_4d0;
            auVar52._20_4_ = fVar128 * fStack_4cc;
            auVar52._24_4_ = fVar129 * fStack_4c8;
            auVar52._28_4_ = pfVar6[7];
            auVar19 = vfmadd231ps_fma(auVar197,auVar111,local_680);
            auVar20 = vfmadd231ps_fma(auVar216,auVar111,local_6a0);
            auVar108 = vfmadd231ps_fma(auVar52,local_180,auVar111);
            auVar19 = vfmadd231ps_fma(ZEXT1632(auVar19),auVar184,local_5e0);
            auVar20 = vfmadd231ps_fma(ZEXT1632(auVar20),auVar184,local_520);
            auVar108 = vfmadd231ps_fma(ZEXT1632(auVar108),local_400,auVar184);
            auVar19 = vfmadd231ps_fma(ZEXT1632(auVar19),auVar11,local_5c0);
            auVar20 = vfmadd231ps_fma(ZEXT1632(auVar20),auVar11,local_4a0);
            auVar108 = vfmadd231ps_fma(ZEXT1632(auVar108),local_420,auVar11);
            pfVar6 = (float *)(lVar27 + 0x2234728 + lVar99 * 4);
            fVar149 = *pfVar6;
            fVar148 = pfVar6[1];
            fVar123 = pfVar6[2];
            fVar125 = pfVar6[3];
            fVar127 = pfVar6[4];
            fVar128 = pfVar6[5];
            fVar129 = pfVar6[6];
            auVar53._4_4_ = fStack_4fc * fVar148;
            auVar53._0_4_ = local_500 * fVar149;
            auVar53._8_4_ = fStack_4f8 * fVar123;
            auVar53._12_4_ = fStack_4f4 * fVar125;
            auVar53._16_4_ = fStack_4f0 * fVar127;
            auVar53._20_4_ = fStack_4ec * fVar128;
            auVar53._24_4_ = fStack_4e8 * fVar129;
            auVar53._28_4_ = fStack_4e4;
            auVar54._4_4_ = local_6c0._4_4_ * fVar148;
            auVar54._0_4_ = (float)local_6c0 * fVar149;
            auVar54._8_4_ = (float)uStack_6b8 * fVar123;
            auVar54._12_4_ = uStack_6b8._4_4_ * fVar125;
            auVar54._16_4_ = (float)uStack_6b0 * fVar127;
            auVar54._20_4_ = uStack_6b0._4_4_ * fVar128;
            auVar54._24_4_ = (float)uStack_6a8 * fVar129;
            auVar54._28_4_ = uStack_6a8._4_4_;
            auVar55._4_4_ = fVar148 * (float)local_4e0._4_4_;
            auVar55._0_4_ = fVar149 * (float)local_4e0._0_4_;
            auVar55._8_4_ = fVar123 * fStack_4d8;
            auVar55._12_4_ = fVar125 * fStack_4d4;
            auVar55._16_4_ = fVar127 * fStack_4d0;
            auVar55._20_4_ = fVar128 * fStack_4cc;
            auVar55._24_4_ = fVar129 * fStack_4c8;
            auVar55._28_4_ = pfVar6[7];
            auVar11 = *(undefined1 (*) [32])(lVar27 + 0x22342a4 + lVar99 * 4);
            auVar107 = vfmadd231ps_fma(auVar53,auVar11,local_680);
            auVar150 = vfmadd231ps_fma(auVar54,auVar11,local_6a0);
            auVar132 = vfmadd231ps_fma(auVar55,local_180,auVar11);
            auVar11 = *(undefined1 (*) [32])(lVar27 + 0x2233e20 + lVar99 * 4);
            auVar107 = vfmadd231ps_fma(ZEXT1632(auVar107),auVar11,local_5e0);
            auVar150 = vfmadd231ps_fma(ZEXT1632(auVar150),auVar11,local_520);
            auVar132 = vfmadd231ps_fma(ZEXT1632(auVar132),local_400,auVar11);
            auVar11 = *(undefined1 (*) [32])(lVar27 + 0x223399c + lVar99 * 4);
            auVar107 = vfmadd231ps_fma(ZEXT1632(auVar107),auVar11,local_5c0);
            auVar150 = vfmadd231ps_fma(ZEXT1632(auVar150),auVar11,local_4a0);
            auVar132 = vfmadd231ps_fma(ZEXT1632(auVar132),local_420,auVar11);
            auVar203._8_4_ = 0x7fffffff;
            auVar203._0_8_ = 0x7fffffff7fffffff;
            auVar203._12_4_ = 0x7fffffff;
            auVar203._16_4_ = 0x7fffffff;
            auVar203._20_4_ = 0x7fffffff;
            auVar203._24_4_ = 0x7fffffff;
            auVar203._28_4_ = 0x7fffffff;
            auVar11 = vandps_avx(ZEXT1632(auVar19),auVar203);
            auVar184 = vandps_avx(ZEXT1632(auVar20),auVar203);
            auVar184 = vmaxps_avx(auVar11,auVar184);
            auVar11 = vandps_avx(ZEXT1632(auVar108),auVar203);
            auVar11 = vmaxps_avx(auVar184,auVar11);
            auVar93._4_4_ = fStack_11c;
            auVar93._0_4_ = local_120;
            auVar93._8_4_ = fStack_118;
            auVar93._12_4_ = fStack_114;
            auVar93._16_4_ = fStack_110;
            auVar93._20_4_ = fStack_10c;
            auVar93._24_4_ = fStack_108;
            auVar93._28_4_ = fStack_104;
            auVar11 = vcmpps_avx(auVar11,auVar93,1);
            auVar111 = vblendvps_avx(ZEXT1632(auVar19),_local_4c0,auVar11);
            auVar140 = vblendvps_avx(ZEXT1632(auVar20),_local_440,auVar11);
            auVar11 = vandps_avx(ZEXT1632(auVar107),auVar203);
            auVar184 = vandps_avx(ZEXT1632(auVar150),auVar203);
            auVar184 = vmaxps_avx(auVar11,auVar184);
            auVar11 = vandps_avx(auVar203,ZEXT1632(auVar132));
            auVar11 = vmaxps_avx(auVar184,auVar11);
            auVar184 = vcmpps_avx(auVar11,auVar93,1);
            auVar11 = vblendvps_avx(ZEXT1632(auVar107),_local_4c0,auVar184);
            auVar184 = vblendvps_avx(ZEXT1632(auVar150),_local_440,auVar184);
            auVar18 = vfmadd213ps_fma(auVar160,local_420,ZEXT1632(auVar18));
            auVar19 = vfmadd213ps_fma(auVar111,auVar111,ZEXT832(0) << 0x20);
            auVar19 = vfmadd231ps_fma(ZEXT1632(auVar19),auVar140,auVar140);
            auVar160 = vrsqrtps_avx(ZEXT1632(auVar19));
            fVar149 = auVar160._0_4_;
            fVar148 = auVar160._4_4_;
            fVar123 = auVar160._8_4_;
            fVar125 = auVar160._12_4_;
            fVar127 = auVar160._16_4_;
            fVar128 = auVar160._20_4_;
            fVar129 = auVar160._24_4_;
            auVar56._4_4_ = fVar148 * fVar148 * fVar148 * auVar19._4_4_ * -0.5;
            auVar56._0_4_ = fVar149 * fVar149 * fVar149 * auVar19._0_4_ * -0.5;
            auVar56._8_4_ = fVar123 * fVar123 * fVar123 * auVar19._8_4_ * -0.5;
            auVar56._12_4_ = fVar125 * fVar125 * fVar125 * auVar19._12_4_ * -0.5;
            auVar56._16_4_ = fVar127 * fVar127 * fVar127 * -0.0;
            auVar56._20_4_ = fVar128 * fVar128 * fVar128 * -0.0;
            auVar56._24_4_ = fVar129 * fVar129 * fVar129 * -0.0;
            auVar56._28_4_ = 0;
            auVar224._8_4_ = 0x3fc00000;
            auVar224._0_8_ = 0x3fc000003fc00000;
            auVar224._12_4_ = 0x3fc00000;
            auVar224._16_4_ = 0x3fc00000;
            auVar224._20_4_ = 0x3fc00000;
            auVar224._24_4_ = 0x3fc00000;
            auVar224._28_4_ = 0x3fc00000;
            auVar19 = vfmadd231ps_fma(auVar56,auVar224,auVar160);
            fVar149 = auVar19._0_4_;
            fVar148 = auVar19._4_4_;
            auVar57._4_4_ = auVar140._4_4_ * fVar148;
            auVar57._0_4_ = auVar140._0_4_ * fVar149;
            fVar123 = auVar19._8_4_;
            auVar57._8_4_ = auVar140._8_4_ * fVar123;
            fVar125 = auVar19._12_4_;
            auVar57._12_4_ = auVar140._12_4_ * fVar125;
            auVar57._16_4_ = auVar140._16_4_ * 0.0;
            auVar57._20_4_ = auVar140._20_4_ * 0.0;
            auVar57._24_4_ = auVar140._24_4_ * 0.0;
            auVar57._28_4_ = auVar160._28_4_;
            auVar58._4_4_ = fVar148 * -auVar111._4_4_;
            auVar58._0_4_ = fVar149 * -auVar111._0_4_;
            auVar58._8_4_ = fVar123 * -auVar111._8_4_;
            auVar58._12_4_ = fVar125 * -auVar111._12_4_;
            auVar58._16_4_ = -auVar111._16_4_ * 0.0;
            auVar58._20_4_ = -auVar111._20_4_ * 0.0;
            auVar58._24_4_ = -auVar111._24_4_ * 0.0;
            auVar58._28_4_ = auVar140._28_4_;
            auVar19 = vfmadd213ps_fma(auVar11,auVar11,ZEXT832(0) << 0x20);
            auVar19 = vfmadd231ps_fma(ZEXT1632(auVar19),auVar184,auVar184);
            auVar160 = vrsqrtps_avx(ZEXT1632(auVar19));
            auVar59._28_4_ = local_420._28_4_;
            auVar59._0_28_ =
                 ZEXT1628(CONCAT412(fVar125 * 0.0,
                                    CONCAT48(fVar123 * 0.0,CONCAT44(fVar148 * 0.0,fVar149 * 0.0))));
            fVar149 = auVar160._0_4_;
            fVar148 = auVar160._4_4_;
            fVar123 = auVar160._8_4_;
            fVar125 = auVar160._12_4_;
            fVar127 = auVar160._16_4_;
            fVar128 = auVar160._20_4_;
            fVar129 = auVar160._24_4_;
            auVar60._4_4_ = fVar148 * fVar148 * fVar148 * auVar19._4_4_ * -0.5;
            auVar60._0_4_ = fVar149 * fVar149 * fVar149 * auVar19._0_4_ * -0.5;
            auVar60._8_4_ = fVar123 * fVar123 * fVar123 * auVar19._8_4_ * -0.5;
            auVar60._12_4_ = fVar125 * fVar125 * fVar125 * auVar19._12_4_ * -0.5;
            auVar60._16_4_ = fVar127 * fVar127 * fVar127 * -0.0;
            auVar60._20_4_ = fVar128 * fVar128 * fVar128 * -0.0;
            auVar60._24_4_ = fVar129 * fVar129 * fVar129 * -0.0;
            auVar60._28_4_ = 0;
            auVar19 = vfmadd231ps_fma(auVar60,auVar224,auVar160);
            fVar149 = auVar19._0_4_;
            fVar148 = auVar19._4_4_;
            auVar61._4_4_ = auVar184._4_4_ * fVar148;
            auVar61._0_4_ = auVar184._0_4_ * fVar149;
            fVar123 = auVar19._8_4_;
            auVar61._8_4_ = auVar184._8_4_ * fVar123;
            fVar125 = auVar19._12_4_;
            auVar61._12_4_ = auVar184._12_4_ * fVar125;
            auVar61._16_4_ = auVar184._16_4_ * 0.0;
            auVar61._20_4_ = auVar184._20_4_ * 0.0;
            auVar61._24_4_ = auVar184._24_4_ * 0.0;
            auVar61._28_4_ = 0;
            auVar62._4_4_ = fVar148 * -auVar11._4_4_;
            auVar62._0_4_ = fVar149 * -auVar11._0_4_;
            auVar62._8_4_ = fVar123 * -auVar11._8_4_;
            auVar62._12_4_ = fVar125 * -auVar11._12_4_;
            auVar62._16_4_ = -auVar11._16_4_ * 0.0;
            auVar62._20_4_ = -auVar11._20_4_ * 0.0;
            auVar62._24_4_ = -auVar11._24_4_ * 0.0;
            auVar62._28_4_ = auVar160._28_4_;
            auVar63._28_4_ = 0xbf000000;
            auVar63._0_28_ =
                 ZEXT1628(CONCAT412(fVar125 * 0.0,
                                    CONCAT48(fVar123 * 0.0,CONCAT44(fVar148 * 0.0,fVar149 * 0.0))));
            auVar19 = vfmadd213ps_fma(auVar57,ZEXT1632(auVar21),local_200);
            auVar160 = ZEXT1632(auVar21);
            auVar20 = vfmadd213ps_fma(auVar58,auVar160,local_560);
            auVar108 = vfmadd213ps_fma(auVar59,auVar160,ZEXT1632(auVar18));
            auVar132 = vfnmadd213ps_fma(auVar57,auVar160,local_200);
            auVar107 = vfmadd213ps_fma(auVar61,local_640._0_32_,local_1e0);
            auVar106 = vfnmadd213ps_fma(auVar58,auVar160,local_560);
            auVar150 = vfmadd213ps_fma(auVar62,local_640._0_32_,local_1c0);
            local_780 = ZEXT1632(auVar21);
            auVar21 = vfnmadd231ps_fma(ZEXT1632(auVar18),local_780,auVar59);
            auVar18 = vfmadd213ps_fma(auVar63,local_640._0_32_,ZEXT1632(auVar110));
            auVar133 = vfnmadd213ps_fma(auVar61,local_640._0_32_,local_1e0);
            auVar163 = vfnmadd213ps_fma(auVar62,local_640._0_32_,local_1c0);
            auVar170 = vfnmadd231ps_fma(ZEXT1632(auVar110),local_640._0_32_,auVar63);
            auVar160 = vsubps_avx(ZEXT1632(auVar150),ZEXT1632(auVar106));
            auVar11 = vsubps_avx(ZEXT1632(auVar18),ZEXT1632(auVar21));
            auVar64._4_4_ = auVar160._4_4_ * auVar21._4_4_;
            auVar64._0_4_ = auVar160._0_4_ * auVar21._0_4_;
            auVar64._8_4_ = auVar160._8_4_ * auVar21._8_4_;
            auVar64._12_4_ = auVar160._12_4_ * auVar21._12_4_;
            auVar64._16_4_ = auVar160._16_4_ * 0.0;
            auVar64._20_4_ = auVar160._20_4_ * 0.0;
            auVar64._24_4_ = auVar160._24_4_ * 0.0;
            auVar64._28_4_ = 0;
            auVar110 = vfmsub231ps_fma(auVar64,ZEXT1632(auVar106),auVar11);
            auVar65._4_4_ = auVar132._4_4_ * auVar11._4_4_;
            auVar65._0_4_ = auVar132._0_4_ * auVar11._0_4_;
            auVar65._8_4_ = auVar132._8_4_ * auVar11._8_4_;
            auVar65._12_4_ = auVar132._12_4_ * auVar11._12_4_;
            auVar65._16_4_ = auVar11._16_4_ * 0.0;
            auVar65._20_4_ = auVar11._20_4_ * 0.0;
            auVar65._24_4_ = auVar11._24_4_ * 0.0;
            auVar65._28_4_ = auVar11._28_4_;
            auVar140 = ZEXT1632(auVar132);
            auVar11 = vsubps_avx(ZEXT1632(auVar107),auVar140);
            auVar119 = ZEXT1632(auVar21);
            auVar21 = vfmsub231ps_fma(auVar65,auVar119,auVar11);
            auVar66._4_4_ = auVar106._4_4_ * auVar11._4_4_;
            auVar66._0_4_ = auVar106._0_4_ * auVar11._0_4_;
            auVar66._8_4_ = auVar106._8_4_ * auVar11._8_4_;
            auVar66._12_4_ = auVar106._12_4_ * auVar11._12_4_;
            auVar66._16_4_ = auVar11._16_4_ * 0.0;
            auVar66._20_4_ = auVar11._20_4_ * 0.0;
            auVar66._24_4_ = auVar11._24_4_ * 0.0;
            auVar66._28_4_ = auVar11._28_4_;
            auVar132 = vfmsub231ps_fma(auVar66,auVar140,auVar160);
            auVar21 = vfmadd231ps_fma(ZEXT1632(auVar132),ZEXT832(0) << 0x20,ZEXT1632(auVar21));
            auVar21 = vfmadd231ps_fma(ZEXT1632(auVar21),ZEXT832(0) << 0x20,ZEXT1632(auVar110));
            auVar16 = vcmpps_avx(ZEXT1632(auVar21),ZEXT832(0) << 0x20,2);
            local_7a0 = vblendvps_avx(ZEXT1632(auVar133),ZEXT1632(auVar19),auVar16);
            _local_540 = vblendvps_avx(ZEXT1632(auVar163),ZEXT1632(auVar20),auVar16);
            auVar160 = vblendvps_avx(ZEXT1632(auVar170),ZEXT1632(auVar108),auVar16);
            auVar11 = vblendvps_avx(auVar140,ZEXT1632(auVar107),auVar16);
            auVar184 = vblendvps_avx(ZEXT1632(auVar106),ZEXT1632(auVar150),auVar16);
            auVar111 = vblendvps_avx(auVar119,ZEXT1632(auVar18),auVar16);
            auVar140 = vblendvps_avx(ZEXT1632(auVar107),auVar140,auVar16);
            auVar12 = vblendvps_avx(ZEXT1632(auVar150),ZEXT1632(auVar106),auVar16);
            auVar21 = vpackssdw_avx(local_3c0._0_16_,local_3c0._16_16_);
            _local_740 = ZEXT1632(auVar21);
            auVar119 = vblendvps_avx(ZEXT1632(auVar18),auVar119,auVar16);
            auVar140 = vsubps_avx(auVar140,local_7a0);
            auVar12 = vsubps_avx(auVar12,_local_540);
            auVar22 = vsubps_avx(auVar119,auVar160);
            auVar23 = vsubps_avx(local_7a0,auVar11);
            auVar113 = vsubps_avx(_local_540,auVar184);
            auVar26 = vsubps_avx(auVar160,auVar111);
            auVar181._0_4_ = auVar22._0_4_ * local_7a0._0_4_;
            auVar181._4_4_ = auVar22._4_4_ * local_7a0._4_4_;
            auVar181._8_4_ = auVar22._8_4_ * local_7a0._8_4_;
            auVar181._12_4_ = auVar22._12_4_ * local_7a0._12_4_;
            auVar181._16_4_ = auVar22._16_4_ * local_7a0._16_4_;
            auVar181._20_4_ = auVar22._20_4_ * local_7a0._20_4_;
            auVar181._24_4_ = auVar22._24_4_ * local_7a0._24_4_;
            auVar181._28_4_ = 0;
            auVar110 = vfmsub231ps_fma(auVar181,auVar160,auVar140);
            auVar67._4_4_ = auVar140._4_4_ * local_540._4_4_;
            auVar67._0_4_ = auVar140._0_4_ * local_540._0_4_;
            auVar67._8_4_ = auVar140._8_4_ * local_540._8_4_;
            auVar67._12_4_ = auVar140._12_4_ * local_540._12_4_;
            auVar67._16_4_ = auVar140._16_4_ * local_540._16_4_;
            auVar67._20_4_ = auVar140._20_4_ * local_540._20_4_;
            auVar67._24_4_ = auVar140._24_4_ * local_540._24_4_;
            auVar67._28_4_ = auVar119._28_4_;
            auVar18 = vfmsub231ps_fma(auVar67,local_7a0,auVar12);
            auVar218 = ZEXT864(0) << 0x20;
            auVar110 = vfmadd231ps_fma(ZEXT1632(auVar18),ZEXT832(0) << 0x20,ZEXT1632(auVar110));
            auVar182._0_4_ = auVar12._0_4_ * auVar160._0_4_;
            auVar182._4_4_ = auVar12._4_4_ * auVar160._4_4_;
            auVar182._8_4_ = auVar12._8_4_ * auVar160._8_4_;
            auVar182._12_4_ = auVar12._12_4_ * auVar160._12_4_;
            auVar182._16_4_ = auVar12._16_4_ * auVar160._16_4_;
            auVar182._20_4_ = auVar12._20_4_ * auVar160._20_4_;
            auVar182._24_4_ = auVar12._24_4_ * auVar160._24_4_;
            auVar182._28_4_ = 0;
            auVar18 = vfmsub231ps_fma(auVar182,_local_540,auVar22);
            auVar18 = vfmadd231ps_fma(ZEXT1632(auVar110),ZEXT832(0) << 0x20,ZEXT1632(auVar18));
            auVar162 = ZEXT1664(auVar18);
            auVar183._0_4_ = auVar26._0_4_ * auVar11._0_4_;
            auVar183._4_4_ = auVar26._4_4_ * auVar11._4_4_;
            auVar183._8_4_ = auVar26._8_4_ * auVar11._8_4_;
            auVar183._12_4_ = auVar26._12_4_ * auVar11._12_4_;
            auVar183._16_4_ = auVar26._16_4_ * auVar11._16_4_;
            auVar183._20_4_ = auVar26._20_4_ * auVar11._20_4_;
            auVar183._24_4_ = auVar26._24_4_ * auVar11._24_4_;
            auVar183._28_4_ = 0;
            auVar110 = vfmsub231ps_fma(auVar183,auVar23,auVar111);
            auVar68._4_4_ = auVar113._4_4_ * auVar111._4_4_;
            auVar68._0_4_ = auVar113._0_4_ * auVar111._0_4_;
            auVar68._8_4_ = auVar113._8_4_ * auVar111._8_4_;
            auVar68._12_4_ = auVar113._12_4_ * auVar111._12_4_;
            auVar68._16_4_ = auVar113._16_4_ * auVar111._16_4_;
            auVar68._20_4_ = auVar113._20_4_ * auVar111._20_4_;
            auVar68._24_4_ = auVar113._24_4_ * auVar111._24_4_;
            auVar68._28_4_ = auVar111._28_4_;
            auVar19 = vfmsub231ps_fma(auVar68,auVar184,auVar26);
            auVar69._4_4_ = auVar23._4_4_ * auVar184._4_4_;
            auVar69._0_4_ = auVar23._0_4_ * auVar184._0_4_;
            auVar69._8_4_ = auVar23._8_4_ * auVar184._8_4_;
            auVar69._12_4_ = auVar23._12_4_ * auVar184._12_4_;
            auVar69._16_4_ = auVar23._16_4_ * auVar184._16_4_;
            auVar69._20_4_ = auVar23._20_4_ * auVar184._20_4_;
            auVar69._24_4_ = auVar23._24_4_ * auVar184._24_4_;
            auVar69._28_4_ = auVar184._28_4_;
            auVar20 = vfmsub231ps_fma(auVar69,auVar113,auVar11);
            auVar110 = vfmadd231ps_fma(ZEXT1632(auVar20),ZEXT832(0) << 0x20,ZEXT1632(auVar110));
            auVar19 = vfmadd231ps_fma(ZEXT1632(auVar110),ZEXT832(0) << 0x20,ZEXT1632(auVar19));
            auVar11 = vmaxps_avx(ZEXT1632(auVar18),ZEXT1632(auVar19));
            auVar11 = vcmpps_avx(auVar11,ZEXT832(0) << 0x20,2);
            auVar110 = vpackssdw_avx(auVar11._0_16_,auVar11._16_16_);
            auVar21 = vpand_avx(auVar110,auVar21);
            auVar11 = vpmovsxwd_avx2(auVar21);
            if ((((((((auVar11 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar11 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar11 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar11 >> 0x7f,0) == '\0') &&
                  (auVar11 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar11 >> 0xbf,0) == '\0') &&
                (auVar11 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar11[0x1f]) {
LAB_016c4a7c:
              auVar190 = ZEXT3264(CONCAT824(local_480[1]._24_8_,
                                            CONCAT816(local_480[1]._16_8_,
                                                      CONCAT88(local_480[1]._8_8_,local_480[1]._0_8_
                                                              ))));
            }
            else {
              auVar70._4_4_ = auVar12._4_4_ * auVar26._4_4_;
              auVar70._0_4_ = auVar12._0_4_ * auVar26._0_4_;
              auVar70._8_4_ = auVar12._8_4_ * auVar26._8_4_;
              auVar70._12_4_ = auVar12._12_4_ * auVar26._12_4_;
              auVar70._16_4_ = auVar12._16_4_ * auVar26._16_4_;
              auVar70._20_4_ = auVar12._20_4_ * auVar26._20_4_;
              auVar70._24_4_ = auVar12._24_4_ * auVar26._24_4_;
              auVar70._28_4_ = auVar11._28_4_;
              auVar107 = vfmsub231ps_fma(auVar70,auVar113,auVar22);
              auVar189._0_4_ = auVar23._0_4_ * auVar22._0_4_;
              auVar189._4_4_ = auVar23._4_4_ * auVar22._4_4_;
              auVar189._8_4_ = auVar23._8_4_ * auVar22._8_4_;
              auVar189._12_4_ = auVar23._12_4_ * auVar22._12_4_;
              auVar189._16_4_ = auVar23._16_4_ * auVar22._16_4_;
              auVar189._20_4_ = auVar23._20_4_ * auVar22._20_4_;
              auVar189._24_4_ = auVar23._24_4_ * auVar22._24_4_;
              auVar189._28_4_ = 0;
              auVar108 = vfmsub231ps_fma(auVar189,auVar140,auVar26);
              auVar71._4_4_ = auVar140._4_4_ * auVar113._4_4_;
              auVar71._0_4_ = auVar140._0_4_ * auVar113._0_4_;
              auVar71._8_4_ = auVar140._8_4_ * auVar113._8_4_;
              auVar71._12_4_ = auVar140._12_4_ * auVar113._12_4_;
              auVar71._16_4_ = auVar140._16_4_ * auVar113._16_4_;
              auVar71._20_4_ = auVar140._20_4_ * auVar113._20_4_;
              auVar71._24_4_ = auVar140._24_4_ * auVar113._24_4_;
              auVar71._28_4_ = auVar113._28_4_;
              auVar150 = vfmsub231ps_fma(auVar71,auVar23,auVar12);
              auVar110 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar108),ZEXT1632(auVar150));
              auVar20 = vfmadd231ps_fma(ZEXT1632(auVar110),ZEXT1632(auVar107),ZEXT832(0) << 0x20);
              auVar11 = vrcpps_avx(ZEXT1632(auVar20));
              auVar217._8_4_ = 0x3f800000;
              auVar217._0_8_ = &DAT_3f8000003f800000;
              auVar217._12_4_ = 0x3f800000;
              auVar217._16_4_ = 0x3f800000;
              auVar217._20_4_ = 0x3f800000;
              auVar217._24_4_ = 0x3f800000;
              auVar217._28_4_ = 0x3f800000;
              auVar218 = ZEXT3264(auVar217);
              auVar110 = vfnmadd213ps_fma(auVar11,ZEXT1632(auVar20),auVar217);
              auVar110 = vfmadd132ps_fma(ZEXT1632(auVar110),auVar11,auVar11);
              auVar72._4_4_ = auVar150._4_4_ * auVar160._4_4_;
              auVar72._0_4_ = auVar150._0_4_ * auVar160._0_4_;
              auVar72._8_4_ = auVar150._8_4_ * auVar160._8_4_;
              auVar72._12_4_ = auVar150._12_4_ * auVar160._12_4_;
              auVar72._16_4_ = auVar160._16_4_ * 0.0;
              auVar72._20_4_ = auVar160._20_4_ * 0.0;
              auVar72._24_4_ = auVar160._24_4_ * 0.0;
              auVar72._28_4_ = auVar160._28_4_;
              auVar108 = vfmadd231ps_fma(auVar72,ZEXT1632(auVar108),_local_540);
              auVar108 = vfmadd231ps_fma(ZEXT1632(auVar108),ZEXT1632(auVar107),local_7a0);
              fVar148 = auVar110._0_4_;
              fVar123 = auVar110._4_4_;
              fVar125 = auVar110._8_4_;
              fVar127 = auVar110._12_4_;
              auVar184 = ZEXT1632(CONCAT412(fVar127 * auVar108._12_4_,
                                            CONCAT48(fVar125 * auVar108._8_4_,
                                                     CONCAT44(fVar123 * auVar108._4_4_,
                                                              fVar148 * auVar108._0_4_))));
              fVar149 = (ray->super_RayK<1>).tfar;
              auVar168._4_4_ = fVar149;
              auVar168._0_4_ = fVar149;
              auVar168._8_4_ = fVar149;
              auVar168._12_4_ = fVar149;
              auVar168._16_4_ = fVar149;
              auVar168._20_4_ = fVar149;
              auVar168._24_4_ = fVar149;
              auVar168._28_4_ = fVar149;
              auVar92._4_4_ = uStack_13c;
              auVar92._0_4_ = local_140;
              auVar92._8_4_ = uStack_138;
              auVar92._12_4_ = uStack_134;
              auVar92._16_4_ = uStack_130;
              auVar92._20_4_ = uStack_12c;
              auVar92._24_4_ = uStack_128;
              auVar92._28_4_ = uStack_124;
              auVar160 = vcmpps_avx(auVar92,auVar184,2);
              auVar11 = vcmpps_avx(auVar184,auVar168,2);
              auVar160 = vandps_avx(auVar11,auVar160);
              auVar110 = vpackssdw_avx(auVar160._0_16_,auVar160._16_16_);
              auVar21 = vpand_avx(auVar21,auVar110);
              auVar160 = vpmovsxwd_avx2(auVar21);
              if ((((((((auVar160 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar160 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar160 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar160 >> 0x7f,0) == '\0') &&
                    (auVar160 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar160 >> 0xbf,0) == '\0') &&
                  (auVar160 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar160[0x1f]) goto LAB_016c4a7c;
              auVar160 = vcmpps_avx(ZEXT1632(auVar20),ZEXT832(0) << 0x20,4);
              auVar110 = vpackssdw_avx(auVar160._0_16_,auVar160._16_16_);
              auVar21 = vpand_avx(auVar21,auVar110);
              auVar160 = vpmovsxwd_avx2(auVar21);
              auVar190 = ZEXT3264(CONCAT824(local_480[1]._24_8_,
                                            CONCAT816(local_480[1]._16_8_,
                                                      CONCAT88(local_480[1]._8_8_,local_480[1]._0_8_
                                                              ))));
              if ((((((((auVar160 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar160 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar160 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar160 >> 0x7f,0) != '\0') ||
                    (auVar160 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar160 >> 0xbf,0) != '\0') ||
                  (auVar160 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar160[0x1f] < '\0') {
                auVar111 = ZEXT1632(CONCAT412(fVar127 * auVar18._12_4_,
                                              CONCAT48(fVar125 * auVar18._8_4_,
                                                       CONCAT44(fVar123 * auVar18._4_4_,
                                                                fVar148 * auVar18._0_4_))));
                auVar73._28_4_ = SUB84(local_480[1]._24_8_,4);
                auVar73._0_28_ =
                     ZEXT1628(CONCAT412(fVar127 * auVar19._12_4_,
                                        CONCAT48(fVar125 * auVar19._8_4_,
                                                 CONCAT44(fVar123 * auVar19._4_4_,
                                                          fVar148 * auVar19._0_4_))));
                auVar198._8_4_ = 0x3f800000;
                auVar198._0_8_ = &DAT_3f8000003f800000;
                auVar198._12_4_ = 0x3f800000;
                auVar198._16_4_ = 0x3f800000;
                auVar198._20_4_ = 0x3f800000;
                auVar198._24_4_ = 0x3f800000;
                auVar198._28_4_ = 0x3f800000;
                auVar11 = vsubps_avx(auVar198,auVar111);
                local_100 = vblendvps_avx(auVar11,auVar111,auVar16);
                auVar11 = vsubps_avx(auVar198,auVar73);
                local_260 = vblendvps_avx(auVar11,auVar73,auVar16);
                auVar162 = ZEXT3264(local_260);
                auVar190 = ZEXT3264(auVar160);
                local_3e0 = auVar184;
              }
            }
            auVar225 = ZEXT3264(local_6a0);
            auVar213 = ZEXT3264(local_680);
            auVar209 = ZEXT3264(local_660);
            auVar204 = ZEXT3264(local_6e0);
            auVar160 = auVar190._0_32_;
            auVar23 = _local_740;
            if ((((((((auVar160 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar160 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar160 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar160 >> 0x7f,0) == '\0') &&
                  (auVar190 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
                 SUB321(auVar160 >> 0xbf,0) == '\0') &&
                (auVar190 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
                -1 < auVar190[0x1f]) goto LAB_016c4741;
            auVar11 = vsubps_avx(local_640._0_32_,local_780);
            auVar21 = vfmadd213ps_fma(auVar11,local_100,local_780);
            fVar149 = pre->depth_scale;
            auVar74._4_4_ = (auVar21._4_4_ + auVar21._4_4_) * fVar149;
            auVar74._0_4_ = (auVar21._0_4_ + auVar21._0_4_) * fVar149;
            auVar74._8_4_ = (auVar21._8_4_ + auVar21._8_4_) * fVar149;
            auVar74._12_4_ = (auVar21._12_4_ + auVar21._12_4_) * fVar149;
            auVar74._16_4_ = fVar149 * 0.0;
            auVar74._20_4_ = fVar149 * 0.0;
            auVar74._24_4_ = fVar149 * 0.0;
            auVar74._28_4_ = fVar149;
            auVar11 = vcmpps_avx(local_3e0,auVar74,6);
            auVar184 = auVar160 & auVar11;
            auVar194 = ZEXT3264(CONCAT428(fStack_4e4,
                                          CONCAT424(fStack_4e8,
                                                    CONCAT420(fStack_4ec,
                                                              CONCAT416(fStack_4f0,
                                                                        CONCAT412(fStack_4f4,
                                                                                  CONCAT48(
                                                  fStack_4f8,CONCAT44(fStack_4fc,local_500))))))));
            auVar199 = ZEXT3264(local_5e0);
            auVar190 = ZEXT3264(local_5c0);
            if ((((((((auVar184 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar184 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar184 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar184 >> 0x7f,0) != '\0') ||
                  (auVar184 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar184 >> 0xbf,0) != '\0') ||
                (auVar184 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar184[0x1f] < '\0') {
              auVar160 = vandps_avx(auVar11,auVar160);
              auVar143._8_4_ = 0xbf800000;
              auVar143._0_8_ = 0xbf800000bf800000;
              auVar143._12_4_ = 0xbf800000;
              auVar143._16_4_ = 0xbf800000;
              auVar143._20_4_ = 0xbf800000;
              auVar143._24_4_ = 0xbf800000;
              auVar143._28_4_ = 0xbf800000;
              auVar161._8_4_ = 0x40000000;
              auVar161._0_8_ = 0x4000000040000000;
              auVar161._12_4_ = 0x40000000;
              auVar161._16_4_ = 0x40000000;
              auVar161._20_4_ = 0x40000000;
              auVar161._24_4_ = 0x40000000;
              auVar161._28_4_ = 0x40000000;
              auVar162 = ZEXT3264(auVar161);
              auVar21 = vfmadd213ps_fma(local_260,auVar161,auVar143);
              local_3a0 = local_100;
              local_260 = ZEXT1632(auVar21);
              auVar11 = local_260;
              local_380 = ZEXT1632(auVar21);
              local_360 = local_3e0;
              local_33c = iVar14;
              local_330 = local_720;
              uStack_328 = uStack_718;
              local_320 = local_5f0;
              uStack_318 = uStack_5e8;
              local_310 = local_600;
              uStack_308 = uStack_5f8;
              local_300 = CONCAT44(fStack_60c,local_610);
              uStack_2f8 = CONCAT44(fStack_604,fStack_608);
              local_2e0 = auVar160;
              pGVar101 = (context->scene->geometries).items[local_7a8].ptr;
              if ((pGVar101->mask & (ray->super_RayK<1>).mask) != 0) {
                local_480[0] = auVar160;
                fVar149 = (float)local_340;
                local_2c0[0] = (fVar149 + local_100._0_4_ + 0.0) * local_160;
                local_2c0[1] = (fVar149 + local_100._4_4_ + 1.0) * fStack_15c;
                local_2c0[2] = (fVar149 + local_100._8_4_ + 2.0) * fStack_158;
                local_2c0[3] = (fVar149 + local_100._12_4_ + 3.0) * fStack_154;
                fStack_2b0 = (fVar149 + local_100._16_4_ + 4.0) * fStack_150;
                fStack_2ac = (fVar149 + local_100._20_4_ + 5.0) * fStack_14c;
                fStack_2a8 = (fVar149 + local_100._24_4_ + 6.0) * fStack_148;
                fStack_2a4 = fVar149 + local_100._28_4_ + 7.0;
                local_260._0_8_ = auVar21._0_8_;
                local_260._8_8_ = auVar21._8_8_;
                local_2a0 = local_260._0_8_;
                uStack_298 = local_260._8_8_;
                uStack_290 = 0;
                uStack_288 = 0;
                local_280 = local_3e0;
                auVar144._8_4_ = 0x7f800000;
                auVar144._0_8_ = 0x7f8000007f800000;
                auVar144._12_4_ = 0x7f800000;
                auVar144._16_4_ = 0x7f800000;
                auVar144._20_4_ = 0x7f800000;
                auVar144._24_4_ = 0x7f800000;
                auVar144._28_4_ = 0x7f800000;
                auVar184 = vblendvps_avx(auVar144,local_3e0,auVar160);
                auVar111 = vshufps_avx(auVar184,auVar184,0xb1);
                auVar111 = vminps_avx(auVar184,auVar111);
                auVar140 = vshufpd_avx(auVar111,auVar111,5);
                auVar111 = vminps_avx(auVar111,auVar140);
                auVar140 = vpermpd_avx2(auVar111,0x4e);
                auVar111 = vminps_avx(auVar111,auVar140);
                auVar184 = vcmpps_avx(auVar184,auVar111,0);
                auVar111 = auVar160 & auVar184;
                if ((((((((auVar111 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar111 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar111 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar111 >> 0x7f,0) != '\0') ||
                      (auVar111 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar111 >> 0xbf,0) != '\0') ||
                    (auVar111 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar111[0x1f] < '\0') {
                  auVar160 = vandps_avx(auVar184,auVar160);
                }
                uVar97 = vmovmskps_avx(auVar160);
                uVar95 = 0;
                for (; (uVar97 & 1) == 0; uVar97 = uVar97 >> 1 | 0x80000000) {
                  uVar95 = uVar95 + 1;
                }
                uVar98 = (ulong)uVar95;
                local_260 = auVar11;
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar101->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  fVar149 = local_2c0[uVar98];
                  fVar148 = 1.0 - fVar149;
                  auVar110 = ZEXT416((uint)fVar149);
                  auVar21 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar110,
                                            ZEXT416(0xc0a00000));
                  auVar17 = vfmadd231ss_fma(ZEXT416((uint)(fVar149 * fVar149 * 3.0)),
                                            ZEXT416((uint)(fVar149 + fVar149)),auVar21);
                  auVar21 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar110,
                                            ZEXT416(0x40000000));
                  auVar21 = vfmadd231ss_fma(ZEXT416((uint)(fVar148 * fVar148 * -3.0)),
                                            ZEXT416((uint)(fVar148 + fVar148)),auVar21);
                  auVar18 = vfnmadd231ss_fma(ZEXT416((uint)(fVar149 * (fVar148 + fVar148))),
                                             ZEXT416((uint)fVar148),ZEXT416((uint)fVar148));
                  auVar110 = vfmadd231ss_fma(ZEXT416((uint)(fVar149 * fVar149)),auVar110,
                                             ZEXT416((uint)(fVar148 * -2.0)));
                  fVar148 = auVar21._0_4_ * 0.5;
                  fVar123 = auVar110._0_4_ * 0.5;
                  auVar166._0_4_ = fVar123 * local_610;
                  auVar166._4_4_ = fVar123 * fStack_60c;
                  auVar166._8_4_ = fVar123 * fStack_608;
                  auVar166._12_4_ = fVar123 * fStack_604;
                  auVar135._4_4_ = fVar148;
                  auVar135._0_4_ = fVar148;
                  auVar135._8_4_ = fVar148;
                  auVar135._12_4_ = fVar148;
                  auVar90._8_8_ = uStack_5f8;
                  auVar90._0_8_ = local_600;
                  auVar21 = vfmadd132ps_fma(auVar135,auVar166,auVar90);
                  fVar148 = auVar17._0_4_ * 0.5;
                  auVar167._4_4_ = fVar148;
                  auVar167._0_4_ = fVar148;
                  auVar167._8_4_ = fVar148;
                  auVar167._12_4_ = fVar148;
                  auVar91._8_8_ = uStack_5e8;
                  auVar91._0_8_ = local_5f0;
                  auVar21 = vfmadd132ps_fma(auVar167,auVar21,auVar91);
                  fVar148 = *(float *)((long)&local_2a0 + uVar98 * 4);
                  fVar123 = auVar18._0_4_ * 0.5;
                  auVar152._4_4_ = fVar123;
                  auVar152._0_4_ = fVar123;
                  auVar152._8_4_ = fVar123;
                  auVar152._12_4_ = fVar123;
                  auVar85._8_8_ = uStack_718;
                  auVar85._0_8_ = local_720;
                  auVar21 = vfmadd132ps_fma(auVar152,auVar21,auVar85);
                  auVar162 = ZEXT1664(auVar21);
                  (ray->super_RayK<1>).tfar = *(float *)(local_280 + uVar98 * 4);
                  uVar104 = vmovlps_avx(auVar21);
                  *(undefined8 *)&(ray->Ng).field_0 = uVar104;
                  fVar123 = (float)vextractps_avx(auVar21,2);
                  (ray->Ng).field_0.field_0.z = fVar123;
                  ray->u = fVar149;
                  ray->v = fVar148;
                  ray->primID = (uint)local_748;
                  ray->geomID = (uint)local_7a8;
                  ray->instID[0] = context->user->instID[0];
                  ray->instPrimID[0] = context->user->instPrimID[0];
                }
                else {
                  local_7a0._8_8_ = uStack_5e8;
                  local_7a0._0_8_ = local_5f0;
                  local_640._0_16_ = CONCAT88(uStack_5f8,local_600);
                  local_640._0_32_ = ZEXT1632(local_640._0_16_);
                  uStack_538 = CONCAT44(fStack_604,fStack_608);
                  local_540 = (undefined1  [8])CONCAT44(fStack_60c,local_610);
                  local_560 = ZEXT1632(CONCAT88(auVar17._8_8_,pGVar101));
                  local_7b0 = prim;
                  local_7b8 = context;
                  local_7c0 = pre;
                  do {
                    local_584 = local_2c0[uVar98];
                    local_580 = *(undefined4 *)((long)&local_2a0 + uVar98 * 4);
                    local_740._0_4_ = (ray->super_RayK<1>).tfar;
                    local_780._0_8_ = uVar98;
                    (ray->super_RayK<1>).tfar = *(float *)(local_280 + uVar98 * 4);
                    fVar149 = 1.0 - local_584;
                    auVar110 = ZEXT416((uint)local_584);
                    auVar21 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar110,
                                              ZEXT416(0xc0a00000));
                    auVar17 = vfmadd231ss_fma(ZEXT416((uint)(local_584 * local_584 * 3.0)),
                                              ZEXT416((uint)(local_584 + local_584)),auVar21);
                    auVar21 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar110,
                                              ZEXT416(0x40000000));
                    auVar21 = vfmadd231ss_fma(ZEXT416((uint)(fVar149 * fVar149 * -3.0)),
                                              ZEXT416((uint)(fVar149 + fVar149)),auVar21);
                    auVar18 = vfnmadd231ss_fma(ZEXT416((uint)(local_584 * (fVar149 + fVar149))),
                                               ZEXT416((uint)fVar149),ZEXT416((uint)fVar149));
                    auVar110 = vfmadd231ss_fma(ZEXT416((uint)(local_584 * local_584)),auVar110,
                                               ZEXT416((uint)(fVar149 * -2.0)));
                    fVar149 = auVar21._0_4_ * 0.5;
                    fVar148 = auVar110._0_4_ * 0.5;
                    auVar172._0_4_ = fVar148 * (float)local_540._0_4_;
                    auVar172._4_4_ = fVar148 * (float)local_540._4_4_;
                    auVar172._8_4_ = fVar148 * (float)uStack_538;
                    auVar172._12_4_ = fVar148 * uStack_538._4_4_;
                    auVar153._4_4_ = fVar149;
                    auVar153._0_4_ = fVar149;
                    auVar153._8_4_ = fVar149;
                    auVar153._12_4_ = fVar149;
                    auVar21 = vfmadd132ps_fma(auVar153,auVar172,local_640._0_16_);
                    fVar149 = auVar17._0_4_ * 0.5;
                    auVar173._4_4_ = fVar149;
                    auVar173._0_4_ = fVar149;
                    auVar173._8_4_ = fVar149;
                    auVar173._12_4_ = fVar149;
                    auVar21 = vfmadd132ps_fma(auVar173,auVar21,local_7a0._0_16_);
                    fVar149 = auVar18._0_4_ * 0.5;
                    auVar154._4_4_ = fVar149;
                    auVar154._0_4_ = fVar149;
                    auVar154._8_4_ = fVar149;
                    auVar154._12_4_ = fVar149;
                    auVar86._8_8_ = uStack_718;
                    auVar86._0_8_ = local_720;
                    auVar21 = vfmadd132ps_fma(auVar154,auVar21,auVar86);
                    local_710.context = context->user;
                    local_590 = vmovlps_avx(auVar21);
                    local_588 = vextractps_avx(auVar21,2);
                    local_57c = (int)local_748;
                    local_578 = (int)local_7a8;
                    local_574 = (local_710.context)->instID[0];
                    local_570 = (local_710.context)->instPrimID[0];
                    local_7c4 = -1;
                    local_710.valid = &local_7c4;
                    local_710.geometryUserPtr = pGVar101->userPtr;
                    local_710.ray = (RTCRayN *)ray;
                    local_710.hit = (RTCHitN *)&local_590;
                    local_710.N = 1;
                    if (pGVar101->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_016c4d20:
                      p_Var15 = context->args->filter;
                      if (p_Var15 != (RTCFilterFunctionN)0x0) {
                        if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                           (((pGVar101->field_8).field_0x2 & 0x40) != 0)) {
                          auVar218 = ZEXT1664(auVar218._0_16_);
                          (*p_Var15)(&local_710);
                          pGVar101 = (Geometry *)local_560._0_8_;
                        }
                        auVar209 = ZEXT3264(local_660);
                        auVar204 = ZEXT3264(local_6e0);
                        auVar213 = ZEXT3264(local_680);
                        auVar225 = ZEXT3264(local_6a0);
                        auVar199 = ZEXT3264(local_5e0);
                        prim = local_7b0;
                        context = local_7b8;
                        pre = local_7c0;
                        fVar231 = (float)local_6c0;
                        fVar232 = local_6c0._4_4_;
                        fVar122 = (float)uStack_6b8;
                        fVar124 = uStack_6b8._4_4_;
                        fVar126 = (float)uStack_6b0;
                        fVar233 = uStack_6b0._4_4_;
                        fVar234 = (float)uStack_6a8;
                        if (*local_710.valid == 0) goto LAB_016c4e0d;
                      }
                      (((Vec3f *)((long)local_710.ray + 0x30))->field_0).components[0] =
                           *(float *)local_710.hit;
                      (((Vec3f *)((long)local_710.ray + 0x30))->field_0).field_0.y =
                           *(float *)(local_710.hit + 4);
                      (((Vec3f *)((long)local_710.ray + 0x30))->field_0).field_0.z =
                           *(float *)(local_710.hit + 8);
                      *(float *)((long)local_710.ray + 0x3c) = *(float *)(local_710.hit + 0xc);
                      *(float *)((long)local_710.ray + 0x40) = *(float *)(local_710.hit + 0x10);
                      *(float *)((long)local_710.ray + 0x44) = *(float *)(local_710.hit + 0x14);
                      *(float *)((long)local_710.ray + 0x48) = *(float *)(local_710.hit + 0x18);
                      *(float *)((long)local_710.ray + 0x4c) = *(float *)(local_710.hit + 0x1c);
                      *(float *)((long)local_710.ray + 0x50) = *(float *)(local_710.hit + 0x20);
                    }
                    else {
                      auVar218 = ZEXT1664(auVar218._0_16_);
                      (*pGVar101->intersectionFilterN)(&local_710);
                      auVar199 = ZEXT3264(local_5e0);
                      auVar225 = ZEXT3264(local_6a0);
                      auVar213 = ZEXT3264(local_680);
                      auVar204 = ZEXT3264(local_6e0);
                      auVar209 = ZEXT3264(local_660);
                      pGVar101 = (Geometry *)local_560._0_8_;
                      prim = local_7b0;
                      context = local_7b8;
                      pre = local_7c0;
                      fVar231 = (float)local_6c0;
                      fVar232 = local_6c0._4_4_;
                      fVar122 = (float)uStack_6b8;
                      fVar124 = uStack_6b8._4_4_;
                      fVar126 = (float)uStack_6b0;
                      fVar233 = uStack_6b0._4_4_;
                      fVar234 = (float)uStack_6a8;
                      if (*local_710.valid != 0) goto LAB_016c4d20;
LAB_016c4e0d:
                      (ray->super_RayK<1>).tfar = (float)local_740._0_4_;
                      prim = local_7b0;
                      context = local_7b8;
                      pre = local_7c0;
                    }
                    auVar111 = local_3e0;
                    *(undefined4 *)(local_480[0] + local_780._0_8_ * 4) = 0;
                    auVar184 = local_480[0];
                    fVar149 = (ray->super_RayK<1>).tfar;
                    auVar120._4_4_ = fVar149;
                    auVar120._0_4_ = fVar149;
                    auVar120._8_4_ = fVar149;
                    auVar120._12_4_ = fVar149;
                    auVar120._16_4_ = fVar149;
                    auVar120._20_4_ = fVar149;
                    auVar120._24_4_ = fVar149;
                    auVar120._28_4_ = fVar149;
                    auVar11 = vcmpps_avx(auVar111,auVar120,2);
                    auVar160 = vandps_avx(auVar11,local_480[0]);
                    local_480[0] = auVar160;
                    auVar11 = auVar184 & auVar11;
                    bVar81 = (auVar11 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
                    bVar82 = (auVar11 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
                    bVar80 = (auVar11 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
                    bVar79 = SUB321(auVar11 >> 0x7f,0) != '\0';
                    bVar78 = (auVar11 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0;
                    bVar77 = SUB321(auVar11 >> 0xbf,0) != '\0';
                    bVar76 = (auVar11 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0;
                    bVar75 = auVar11[0x1f] < '\0';
                    auVar194 = ZEXT3264(CONCAT428(fStack_4e4,
                                                  CONCAT424(fStack_4e8,
                                                            CONCAT420(fStack_4ec,
                                                                      CONCAT416(fStack_4f0,
                                                                                CONCAT412(fStack_4f4
                                                                                          ,CONCAT48(
                                                  fStack_4f8,CONCAT44(fStack_4fc,local_500))))))));
                    uVar98 = local_780._0_8_;
                    if (((((((bVar81 || bVar82) || bVar80) || bVar79) || bVar78) || bVar77) ||
                        bVar76) || bVar75) {
                      auVar145._8_4_ = 0x7f800000;
                      auVar145._0_8_ = 0x7f8000007f800000;
                      auVar145._12_4_ = 0x7f800000;
                      auVar145._16_4_ = 0x7f800000;
                      auVar145._20_4_ = 0x7f800000;
                      auVar145._24_4_ = 0x7f800000;
                      auVar145._28_4_ = 0x7f800000;
                      auVar11 = vblendvps_avx(auVar145,auVar111,auVar160);
                      auVar184 = vshufps_avx(auVar11,auVar11,0xb1);
                      auVar184 = vminps_avx(auVar11,auVar184);
                      auVar111 = vshufpd_avx(auVar184,auVar184,5);
                      auVar184 = vminps_avx(auVar184,auVar111);
                      auVar111 = vpermpd_avx2(auVar184,0x4e);
                      auVar184 = vminps_avx(auVar184,auVar111);
                      auVar11 = vcmpps_avx(auVar11,auVar184,0);
                      auVar111 = auVar160 & auVar11;
                      if ((((((((auVar111 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               || (auVar111 >> 0x3f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0) ||
                              (auVar111 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                             || SUB321(auVar111 >> 0x7f,0) != '\0') ||
                            (auVar111 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                           SUB321(auVar111 >> 0xbf,0) != '\0') ||
                          (auVar111 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                          auVar111[0x1f] < '\0') {
                        auVar160 = vandps_avx(auVar11,auVar160);
                      }
                      uVar97 = vmovmskps_avx(auVar160);
                      uVar95 = 0;
                      for (; (uVar97 & 1) == 0; uVar97 = uVar97 >> 1 | 0x80000000) {
                        uVar95 = uVar95 + 1;
                      }
                      uVar98 = (ulong)uVar95;
                    }
                    auVar162 = ZEXT3264(auVar184);
                  } while (((((((bVar81 || bVar82) || bVar80) || bVar79) || bVar78) || bVar77) ||
                           bVar76) || bVar75);
                }
                auVar190 = ZEXT3264(local_5c0);
              }
            }
          }
          auVar147 = ZEXT3264(local_520);
          lVar99 = lVar99 + 8;
        } while ((int)lVar99 < iVar14);
      }
      fVar149 = (ray->super_RayK<1>).tfar;
      auVar109._4_4_ = fVar149;
      auVar109._0_4_ = fVar149;
      auVar109._8_4_ = fVar149;
      auVar109._12_4_ = fVar149;
      auVar21 = vcmpps_avx(local_1a0,auVar109,2);
      uVar95 = vmovmskps_avx(auVar21);
      uVar95 = (uint)uVar102 & uVar95;
    } while (uVar95 != 0);
  }
  return;
}

Assistant:

static __forceinline void intersect_t(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }
          
          Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }